

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::QuadMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  BBox1f BVar1;
  undefined4 uVar2;
  float fVar3;
  undefined4 uVar4;
  BVH *bvh;
  Geometry *pGVar5;
  RTCRayQueryContext *pRVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [32];
  ulong uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  size_t k;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  undefined4 uVar84;
  undefined4 uVar85;
  undefined4 uVar86;
  undefined4 uVar87;
  undefined4 uVar88;
  undefined4 uVar89;
  undefined4 uVar90;
  undefined4 uVar91;
  undefined4 uVar92;
  undefined4 uVar93;
  undefined4 uVar94;
  undefined4 uVar95;
  undefined4 uVar96;
  undefined4 uVar97;
  undefined4 uVar98;
  undefined4 uVar99;
  undefined4 uVar100;
  undefined4 uVar101;
  undefined4 uVar102;
  undefined4 uVar103;
  undefined4 uVar104;
  undefined4 uVar105;
  undefined4 uVar106;
  undefined4 uVar107;
  undefined4 uVar108;
  undefined4 uVar109;
  undefined4 uVar110;
  byte bVar111;
  bool bVar112;
  int iVar113;
  AABBNodeMB4D *node1;
  ulong uVar114;
  ulong uVar115;
  byte bVar116;
  long lVar117;
  long lVar118;
  long lVar119;
  undefined1 (*pauVar120) [32];
  ulong uVar121;
  long lVar122;
  long lVar123;
  vuint<4> *v;
  undefined1 auVar129 [16];
  ulong *puVar124;
  NodeRef root;
  byte bVar125;
  ulong uVar126;
  ulong uVar127;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar128 [16];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  vfloat_impl<8> vVar152;
  vfloat_impl<8> vVar153;
  undefined1 auVar154 [32];
  float fVar155;
  float fVar156;
  float fVar158;
  float fVar159;
  undefined1 auVar157 [16];
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 extraout_var [36];
  undefined1 extraout_var_00 [36];
  undefined1 auVar169 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar171 [36];
  undefined1 auVar170 [64];
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar183 [64];
  float fVar190;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar206 [64];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar210 [16];
  float fVar211;
  float fVar212;
  undefined4 uVar213;
  undefined1 in_ZMM11 [64];
  uint uVar214;
  uint uVar215;
  uint uVar216;
  uint uVar217;
  uint uVar218;
  undefined1 in_ZMM12 [64];
  undefined1 in_ZMM13 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  undefined1 auVar227 [64];
  undefined1 in_ZMM23 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  QuadMesh *mesh;
  vbool<8>_conflict valid0;
  Precalculations pre;
  vint<8> itime;
  Vec3<embree::vfloat_impl<8>_> p1;
  Vec3<embree::vfloat_impl<8>_> p0;
  vfloat<8> t;
  vfloat<8> v_1;
  vfloat<8> u;
  TravRayK<8,_false> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  uint local_2c54;
  Precalculations local_2c09;
  ulong local_2c08;
  RTCFilterFunctionNArguments local_2c00;
  ulong local_2bc8;
  ulong local_2bc0;
  RayK<8> *local_2bb8;
  undefined4 local_2bac;
  undefined1 (*local_2ba8) [32];
  float local_2ba0 [4];
  float fStack_2b90;
  float fStack_2b8c;
  float fStack_2b88;
  undefined4 uStack_2b84;
  float local_2b80 [4];
  float fStack_2b70;
  float fStack_2b6c;
  float fStack_2b68;
  undefined4 uStack_2b64;
  float local_2b60 [4];
  float fStack_2b50;
  float fStack_2b4c;
  float fStack_2b48;
  undefined4 uStack_2b44;
  undefined1 local_2b40 [32];
  undefined1 local_2b20 [32];
  undefined1 local_2b00 [32];
  Intersectors *local_2ad8;
  long local_2ad0;
  ulong local_2ac8;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2ac0;
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  uint local_29e0;
  uint uStack_29dc;
  uint uStack_29d8;
  uint uStack_29d4;
  uint uStack_29d0;
  uint uStack_29cc;
  uint uStack_29c8;
  uint uStack_29c4;
  uint local_29c0;
  uint uStack_29bc;
  uint uStack_29b8;
  uint uStack_29b4;
  uint uStack_29b0;
  uint uStack_29ac;
  uint uStack_29a8;
  uint uStack_29a4;
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2840;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  float local_2720;
  float fStack_271c;
  float fStack_2718;
  float fStack_2714;
  float fStack_2710;
  float fStack_270c;
  float fStack_2708;
  undefined4 uStack_2704;
  float local_2700;
  float fStack_26fc;
  float fStack_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  undefined4 uStack_26e4;
  undefined1 local_26e0 [32];
  int local_26c0;
  int iStack_26bc;
  int iStack_26b8;
  int iStack_26b4;
  int iStack_26b0;
  int iStack_26ac;
  int iStack_26a8;
  int iStack_26a4;
  uint local_26a0;
  uint uStack_269c;
  uint uStack_2698;
  uint uStack_2694;
  uint uStack_2690;
  uint uStack_268c;
  uint uStack_2688;
  uint uStack_2684;
  uint local_2680;
  uint uStack_267c;
  uint uStack_2678;
  uint uStack_2674;
  uint uStack_2670;
  uint uStack_266c;
  uint uStack_2668;
  uint uStack_2664;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar168 [36];
  undefined1 auVar172 [36];
  undefined1 auVar205 [32];
  
  bvh = (BVH *)This->ptr;
  local_2608 = (bvh->root).ptr;
  if (local_2608 != 8) {
    auVar130 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
    auVar128 = ZEXT816(0) << 0x40;
    uVar126 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar128),5);
    uVar115 = vpcmpeqd_avx512vl(auVar130,(undefined1  [32])valid_i->field_0);
    uVar126 = uVar126 & uVar115;
    bVar111 = (byte)uVar126;
    if (bVar111 != 0) {
      local_2840._0_4_ = *(float *)ray;
      local_2840._4_4_ = *(float *)(ray + 4);
      local_2840._8_4_ = *(float *)(ray + 8);
      local_2840._12_4_ = *(float *)(ray + 0xc);
      local_2840._16_4_ = *(float *)(ray + 0x10);
      local_2840._20_4_ = *(float *)(ray + 0x14);
      local_2840._24_4_ = *(float *)(ray + 0x18);
      local_2840._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_2840._32_4_ = *(float *)(ray + 0x20);
      local_2840._36_4_ = *(float *)(ray + 0x24);
      local_2840._40_4_ = *(float *)(ray + 0x28);
      local_2840._44_4_ = *(float *)(ray + 0x2c);
      local_2840._48_4_ = *(float *)(ray + 0x30);
      local_2840._52_4_ = *(float *)(ray + 0x34);
      local_2840._56_4_ = *(float *)(ray + 0x38);
      local_2840._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_2840._64_4_ = *(float *)(ray + 0x40);
      local_2840._68_4_ = *(float *)(ray + 0x44);
      local_2840._72_4_ = *(float *)(ray + 0x48);
      local_2840._76_4_ = *(float *)(ray + 0x4c);
      local_2840._80_4_ = *(float *)(ray + 0x50);
      local_2840._84_4_ = *(float *)(ray + 0x54);
      local_2840._88_4_ = *(float *)(ray + 0x58);
      local_2840._92_4_ = *(undefined4 *)(ray + 0x5c);
      local_27e0 = *(undefined1 (*) [32])(ray + 0x80);
      local_27c0 = *(undefined1 (*) [32])(ray + 0xa0);
      local_27a0 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar224 = ZEXT3264(auVar130);
      vandps_avx512vl(local_27e0,auVar130);
      auVar131._8_4_ = 0x219392ef;
      auVar131._0_8_ = 0x219392ef219392ef;
      auVar131._12_4_ = 0x219392ef;
      auVar131._16_4_ = 0x219392ef;
      auVar131._20_4_ = 0x219392ef;
      auVar131._24_4_ = 0x219392ef;
      auVar131._28_4_ = 0x219392ef;
      uVar115 = vcmpps_avx512vl(auVar130,auVar131,1);
      bVar112 = (bool)((byte)uVar115 & 1);
      auVar133._0_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27e0._0_4_;
      bVar112 = (bool)((byte)(uVar115 >> 1) & 1);
      auVar133._4_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27e0._4_4_;
      bVar112 = (bool)((byte)(uVar115 >> 2) & 1);
      auVar133._8_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27e0._8_4_;
      bVar112 = (bool)((byte)(uVar115 >> 3) & 1);
      auVar133._12_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27e0._12_4_;
      bVar112 = (bool)((byte)(uVar115 >> 4) & 1);
      auVar133._16_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27e0._16_4_;
      bVar112 = (bool)((byte)(uVar115 >> 5) & 1);
      auVar133._20_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27e0._20_4_;
      bVar112 = (bool)((byte)(uVar115 >> 6) & 1);
      auVar133._24_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27e0._24_4_;
      bVar112 = SUB81(uVar115 >> 7,0);
      auVar133._28_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27e0._28_4_;
      vandps_avx512vl(local_27c0,auVar130);
      uVar115 = vcmpps_avx512vl(auVar133,auVar131,1);
      bVar112 = (bool)((byte)uVar115 & 1);
      auVar134._0_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27c0._0_4_;
      bVar112 = (bool)((byte)(uVar115 >> 1) & 1);
      auVar134._4_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27c0._4_4_;
      bVar112 = (bool)((byte)(uVar115 >> 2) & 1);
      auVar134._8_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27c0._8_4_;
      bVar112 = (bool)((byte)(uVar115 >> 3) & 1);
      auVar134._12_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27c0._12_4_;
      bVar112 = (bool)((byte)(uVar115 >> 4) & 1);
      auVar134._16_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27c0._16_4_;
      bVar112 = (bool)((byte)(uVar115 >> 5) & 1);
      auVar134._20_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27c0._20_4_;
      bVar112 = (bool)((byte)(uVar115 >> 6) & 1);
      auVar134._24_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27c0._24_4_;
      bVar112 = SUB81(uVar115 >> 7,0);
      auVar134._28_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27c0._28_4_;
      vandps_avx512vl(local_27a0,auVar130);
      uVar115 = vcmpps_avx512vl(auVar134,auVar131,1);
      bVar112 = (bool)((byte)uVar115 & 1);
      auVar130._0_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27a0._0_4_;
      bVar112 = (bool)((byte)(uVar115 >> 1) & 1);
      auVar130._4_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27a0._4_4_;
      bVar112 = (bool)((byte)(uVar115 >> 2) & 1);
      auVar130._8_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27a0._8_4_;
      bVar112 = (bool)((byte)(uVar115 >> 3) & 1);
      auVar130._12_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27a0._12_4_;
      bVar112 = (bool)((byte)(uVar115 >> 4) & 1);
      auVar130._16_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27a0._16_4_;
      bVar112 = (bool)((byte)(uVar115 >> 5) & 1);
      auVar130._20_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27a0._20_4_;
      bVar112 = (bool)((byte)(uVar115 >> 6) & 1);
      auVar130._24_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27a0._24_4_;
      bVar112 = SUB81(uVar115 >> 7,0);
      auVar130._28_4_ = (uint)bVar112 * 0x219392ef | (uint)!bVar112 * local_27a0._28_4_;
      auVar131 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar225 = ZEXT3264(auVar131);
      auVar132 = vrcp14ps_avx512vl(auVar133);
      auVar133 = vfnmadd213ps_avx512vl(auVar133,auVar132,auVar131);
      auVar129 = vfmadd132ps_fma(auVar133,auVar132,auVar132);
      auVar133 = vrcp14ps_avx512vl(auVar134);
      auVar134 = vfnmadd213ps_avx512vl(auVar134,auVar133,auVar131);
      auVar157 = vfmadd132ps_fma(auVar134,auVar133,auVar133);
      auVar133 = vrcp14ps_avx512vl(auVar130);
      auVar130 = vfnmadd213ps_avx512vl(auVar130,auVar133,auVar131);
      local_2780 = ZEXT1632(auVar129);
      local_2760 = ZEXT1632(auVar157);
      auVar164 = vfmadd132ps_fma(auVar130,auVar133,auVar133);
      auVar206 = ZEXT1664(auVar164);
      local_2740 = ZEXT1632(auVar164);
      local_26e0._4_4_ = *(float *)(ray + 0x44) * auVar164._4_4_;
      local_26e0._0_4_ = *(float *)(ray + 0x40) * auVar164._0_4_;
      local_26e0._8_4_ = *(float *)(ray + 0x48) * auVar164._8_4_;
      local_26e0._12_4_ = *(float *)(ray + 0x4c) * auVar164._12_4_;
      local_26e0._16_4_ = *(float *)(ray + 0x50) * 0.0;
      local_26e0._20_4_ = *(float *)(ray + 0x54) * 0.0;
      local_26e0._24_4_ = *(float *)(ray + 0x58) * 0.0;
      local_26e0._28_4_ = *(undefined4 *)(ray + 0x5c);
      auVar183 = ZEXT3264(local_26e0);
      local_2720 = *(float *)ray * auVar129._0_4_;
      fStack_271c = *(float *)(ray + 4) * auVar129._4_4_;
      fStack_2718 = *(float *)(ray + 8) * auVar129._8_4_;
      fStack_2714 = *(float *)(ray + 0xc) * auVar129._12_4_;
      fStack_2710 = *(float *)(ray + 0x10) * 0.0;
      fStack_270c = *(float *)(ray + 0x14) * 0.0;
      fStack_2708 = *(float *)(ray + 0x18) * 0.0;
      uStack_2704 = *(undefined4 *)(ray + 0x1c);
      local_2700 = *(float *)(ray + 0x20) * auVar157._0_4_;
      fStack_26fc = *(float *)(ray + 0x24) * auVar157._4_4_;
      fStack_26f8 = *(float *)(ray + 0x28) * auVar157._8_4_;
      fStack_26f4 = *(float *)(ray + 0x2c) * auVar157._12_4_;
      fStack_26f0 = *(float *)(ray + 0x30) * 0.0;
      fStack_26ec = *(float *)(ray + 0x34) * 0.0;
      fStack_26e8 = *(float *)(ray + 0x38) * 0.0;
      uStack_26e4 = *(undefined4 *)(ray + 0x3c);
      uVar115 = vcmpps_avx512vl(ZEXT1632(auVar129),ZEXT1632(auVar128),1);
      auVar130 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      local_26c0 = (uint)((byte)uVar115 & 1) * auVar130._0_4_;
      iStack_26bc = (uint)((byte)(uVar115 >> 1) & 1) * auVar130._4_4_;
      iStack_26b8 = (uint)((byte)(uVar115 >> 2) & 1) * auVar130._8_4_;
      iStack_26b4 = (uint)((byte)(uVar115 >> 3) & 1) * auVar130._12_4_;
      iStack_26b0 = (uint)((byte)(uVar115 >> 4) & 1) * auVar130._16_4_;
      iStack_26ac = (uint)((byte)(uVar115 >> 5) & 1) * auVar130._20_4_;
      iStack_26a8 = (uint)((byte)(uVar115 >> 6) & 1) * auVar130._24_4_;
      iStack_26a4 = (uint)(byte)(uVar115 >> 7) * auVar130._28_4_;
      auVar133 = ZEXT1632(auVar128);
      uVar115 = vcmpps_avx512vl(ZEXT1632(auVar157),auVar133,5);
      auVar130 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar112 = (bool)((byte)uVar115 & 1);
      bVar8 = (bool)((byte)(uVar115 >> 1) & 1);
      bVar9 = (bool)((byte)(uVar115 >> 2) & 1);
      bVar10 = (bool)((byte)(uVar115 >> 3) & 1);
      bVar11 = (bool)((byte)(uVar115 >> 4) & 1);
      bVar12 = (bool)((byte)(uVar115 >> 5) & 1);
      bVar13 = (bool)((byte)(uVar115 >> 6) & 1);
      bVar14 = SUB81(uVar115 >> 7,0);
      local_26a0 = (uint)bVar112 * auVar130._0_4_ | (uint)!bVar112 * 0x30;
      uStack_269c = (uint)bVar8 * auVar130._4_4_ | (uint)!bVar8 * 0x30;
      uStack_2698 = (uint)bVar9 * auVar130._8_4_ | (uint)!bVar9 * 0x30;
      uStack_2694 = (uint)bVar10 * auVar130._12_4_ | (uint)!bVar10 * 0x30;
      uStack_2690 = (uint)bVar11 * auVar130._16_4_ | (uint)!bVar11 * 0x30;
      uStack_268c = (uint)bVar12 * auVar130._20_4_ | (uint)!bVar12 * 0x30;
      uStack_2688 = (uint)bVar13 * auVar130._24_4_ | (uint)!bVar13 * 0x30;
      uStack_2684 = (uint)bVar14 * auVar130._28_4_ | (uint)!bVar14 * 0x30;
      uVar115 = vcmpps_avx512vl(ZEXT1632(auVar164),auVar133,5);
      auVar130 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar112 = (bool)((byte)uVar115 & 1);
      bVar8 = (bool)((byte)(uVar115 >> 1) & 1);
      bVar9 = (bool)((byte)(uVar115 >> 2) & 1);
      bVar10 = (bool)((byte)(uVar115 >> 3) & 1);
      bVar11 = (bool)((byte)(uVar115 >> 4) & 1);
      bVar12 = (bool)((byte)(uVar115 >> 5) & 1);
      bVar13 = (bool)((byte)(uVar115 >> 6) & 1);
      bVar14 = SUB81(uVar115 >> 7,0);
      local_2680 = (uint)bVar112 * auVar130._0_4_ | (uint)!bVar112 * 0x50;
      uStack_267c = (uint)bVar8 * auVar130._4_4_ | (uint)!bVar8 * 0x50;
      uStack_2678 = (uint)bVar9 * auVar130._8_4_ | (uint)!bVar9 * 0x50;
      uStack_2674 = (uint)bVar10 * auVar130._12_4_ | (uint)!bVar10 * 0x50;
      uStack_2670 = (uint)bVar11 * auVar130._16_4_ | (uint)!bVar11 * 0x50;
      uStack_266c = (uint)bVar12 * auVar130._20_4_ | (uint)!bVar12 * 0x50;
      uStack_2668 = (uint)bVar13 * auVar130._24_4_ | (uint)!bVar13 * 0x50;
      uStack_2664 = (uint)bVar14 * auVar130._28_4_ | (uint)!bVar14 * 0x50;
      local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar227 = ZEXT3264(local_1e80);
      local_2bac = (int)uVar126;
      auVar130 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar133);
      local_2660._0_4_ =
           (uint)(bVar111 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar111 & 1) * local_1e80._0_4_;
      bVar112 = (bool)((byte)(uVar126 >> 1) & 1);
      local_2660._4_4_ = (uint)bVar112 * auVar130._4_4_ | (uint)!bVar112 * local_1e80._4_4_;
      bVar112 = (bool)((byte)(uVar126 >> 2) & 1);
      local_2660._8_4_ = (uint)bVar112 * auVar130._8_4_ | (uint)!bVar112 * local_1e80._8_4_;
      bVar112 = (bool)((byte)(uVar126 >> 3) & 1);
      local_2660._12_4_ = (uint)bVar112 * auVar130._12_4_ | (uint)!bVar112 * local_1e80._12_4_;
      bVar112 = (bool)((byte)(uVar126 >> 4) & 1);
      local_2660._16_4_ = (uint)bVar112 * auVar130._16_4_ | (uint)!bVar112 * local_1e80._16_4_;
      bVar112 = (bool)((byte)(uVar126 >> 5) & 1);
      local_2660._20_4_ = (uint)bVar112 * auVar130._20_4_ | (uint)!bVar112 * local_1e80._20_4_;
      bVar112 = (bool)((byte)(uVar126 >> 6) & 1);
      local_2660._24_4_ = (uint)bVar112 * auVar130._24_4_ | (uint)!bVar112 * local_1e80._24_4_;
      bVar112 = SUB81(uVar126 >> 7,0);
      local_2660._28_4_ = (uint)bVar112 * auVar130._28_4_ | (uint)!bVar112 * local_1e80._28_4_;
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar226 = ZEXT3264(auVar130);
      auVar133 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar133);
      bVar112 = (bool)((byte)(uVar126 >> 1) & 1);
      bVar8 = (bool)((byte)(uVar126 >> 2) & 1);
      bVar9 = (bool)((byte)(uVar126 >> 3) & 1);
      bVar10 = (bool)((byte)(uVar126 >> 4) & 1);
      bVar11 = (bool)((byte)(uVar126 >> 5) & 1);
      bVar12 = (bool)((byte)(uVar126 >> 6) & 1);
      bVar13 = SUB81(uVar126 >> 7,0);
      local_2640._4_4_ = (uint)bVar112 * auVar133._4_4_ | (uint)!bVar112 * auVar130._4_4_;
      local_2640._0_4_ =
           (uint)(bVar111 & 1) * auVar133._0_4_ | (uint)!(bool)(bVar111 & 1) * auVar130._0_4_;
      local_2640._8_4_ = (uint)bVar8 * auVar133._8_4_ | (uint)!bVar8 * auVar130._8_4_;
      local_2640._12_4_ = (uint)bVar9 * auVar133._12_4_ | (uint)!bVar9 * auVar130._12_4_;
      local_2640._16_4_ = (uint)bVar10 * auVar133._16_4_ | (uint)!bVar10 * auVar130._16_4_;
      local_2640._20_4_ = (uint)bVar11 * auVar133._20_4_ | (uint)!bVar11 * auVar130._20_4_;
      local_2640._24_4_ = (uint)bVar12 * auVar133._24_4_ | (uint)!bVar12 * auVar130._24_4_;
      local_2640._28_4_ = (uint)bVar13 * auVar133._28_4_ | (uint)!bVar13 * auVar130._28_4_;
      local_2c54 = (uint)(byte)~bVar111;
      local_2ad8 = This;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar126 = 5;
      }
      else {
        uVar126 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      local_2bb8 = ray + 0x100;
      puVar124 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar120 = (undefined1 (*) [32])local_1e40;
      local_1e60 = local_2660;
      local_2ba8 = (undefined1 (*) [32])&local_29e0;
      auVar128 = vxorps_avx512vl(in_ZMM23._0_16_,in_ZMM23._0_16_);
      auVar228 = ZEXT1664(auVar128);
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar229 = ZEXT3264(auVar130);
      local_2bc0 = uVar126;
LAB_01d096d5:
      do {
        auVar130 = auVar226._0_32_;
        do {
          root.ptr = puVar124[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01d0ab9c;
          puVar124 = puVar124 + -1;
          local_2b20 = pauVar120[-1];
          auVar223 = ZEXT3264(local_2b20);
          pauVar120 = pauVar120 + -1;
          uVar115 = vcmpps_avx512vl(local_2b20,local_2640,1);
        } while ((char)uVar115 == '\0');
        uVar114 = CONCAT44(0,POPCOUNT((int)uVar115));
        bVar112 = uVar126 < uVar114;
        uVar126 = local_2bc0;
        if (bVar112) {
LAB_01d09728:
          do {
            auVar130 = auVar226._0_32_;
            uVar214 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01d0ab9c;
              uVar17 = vcmpps_avx512vl(auVar223._0_32_,local_2640,9);
              if ((char)uVar17 == '\0') goto LAB_01d096d5;
              local_2ad0 = (ulong)(uVar214 & 0xf) - 8;
              bVar111 = ~(byte)local_2c54;
              lVar117 = 0;
              goto LAB_01d09961;
            }
            uVar115 = root.ptr & 0xfffffffffffffff0;
            root.ptr = 8;
            auVar130 = auVar227._0_32_;
            for (lVar117 = -0x10;
                (lVar117 != 0 && (uVar114 = *(ulong *)(uVar115 + 0x20 + lVar117 * 2), uVar114 != 8))
                ; lVar117 = lVar117 + 4) {
              uVar213 = *(undefined4 *)(uVar115 + 0x90 + lVar117);
              auVar181._4_4_ = uVar213;
              auVar181._0_4_ = uVar213;
              auVar181._8_4_ = uVar213;
              auVar181._12_4_ = uVar213;
              auVar181._16_4_ = uVar213;
              auVar181._20_4_ = uVar213;
              auVar181._24_4_ = uVar213;
              auVar181._28_4_ = uVar213;
              auVar133 = *(undefined1 (*) [32])(ray + 0xe0);
              uVar213 = *(undefined4 *)(uVar115 + 0x30 + lVar117);
              auVar21._4_4_ = uVar213;
              auVar21._0_4_ = uVar213;
              auVar21._8_4_ = uVar213;
              auVar21._12_4_ = uVar213;
              auVar21._16_4_ = uVar213;
              auVar21._20_4_ = uVar213;
              auVar21._24_4_ = uVar213;
              auVar21._28_4_ = uVar213;
              auVar134 = vfmadd213ps_avx512vl(auVar181,auVar133,auVar21);
              uVar213 = *(undefined4 *)(uVar115 + 0xb0 + lVar117);
              auVar191._4_4_ = uVar213;
              auVar191._0_4_ = uVar213;
              auVar191._8_4_ = uVar213;
              auVar191._12_4_ = uVar213;
              auVar191._16_4_ = uVar213;
              auVar191._20_4_ = uVar213;
              auVar191._24_4_ = uVar213;
              auVar191._28_4_ = uVar213;
              uVar213 = *(undefined4 *)(uVar115 + 0x50 + lVar117);
              auVar22._4_4_ = uVar213;
              auVar22._0_4_ = uVar213;
              auVar22._8_4_ = uVar213;
              auVar22._12_4_ = uVar213;
              auVar22._16_4_ = uVar213;
              auVar22._20_4_ = uVar213;
              auVar22._24_4_ = uVar213;
              auVar22._28_4_ = uVar213;
              auVar131 = vfmadd213ps_avx512vl(auVar191,auVar133,auVar22);
              uVar213 = *(undefined4 *)(uVar115 + 0xd0 + lVar117);
              auVar197._4_4_ = uVar213;
              auVar197._0_4_ = uVar213;
              auVar197._8_4_ = uVar213;
              auVar197._12_4_ = uVar213;
              auVar197._16_4_ = uVar213;
              auVar197._20_4_ = uVar213;
              auVar197._24_4_ = uVar213;
              auVar197._28_4_ = uVar213;
              uVar213 = *(undefined4 *)(uVar115 + 0x70 + lVar117);
              auVar23._4_4_ = uVar213;
              auVar23._0_4_ = uVar213;
              auVar23._8_4_ = uVar213;
              auVar23._12_4_ = uVar213;
              auVar23._16_4_ = uVar213;
              auVar23._20_4_ = uVar213;
              auVar23._24_4_ = uVar213;
              auVar23._28_4_ = uVar213;
              auVar132 = vfmadd213ps_avx512vl(auVar197,auVar133,auVar23);
              uVar213 = *(undefined4 *)(uVar115 + 0xa0 + lVar117);
              auVar201._4_4_ = uVar213;
              auVar201._0_4_ = uVar213;
              auVar201._8_4_ = uVar213;
              auVar201._12_4_ = uVar213;
              auVar201._16_4_ = uVar213;
              auVar201._20_4_ = uVar213;
              auVar201._24_4_ = uVar213;
              auVar201._28_4_ = uVar213;
              uVar213 = *(undefined4 *)(uVar115 + 0x40 + lVar117);
              auVar24._4_4_ = uVar213;
              auVar24._0_4_ = uVar213;
              auVar24._8_4_ = uVar213;
              auVar24._12_4_ = uVar213;
              auVar24._16_4_ = uVar213;
              auVar24._20_4_ = uVar213;
              auVar24._24_4_ = uVar213;
              auVar24._28_4_ = uVar213;
              auVar135 = vfmadd213ps_avx512vl(auVar201,auVar133,auVar24);
              uVar213 = *(undefined4 *)(uVar115 + 0xc0 + lVar117);
              auVar207._4_4_ = uVar213;
              auVar207._0_4_ = uVar213;
              auVar207._8_4_ = uVar213;
              auVar207._12_4_ = uVar213;
              auVar207._16_4_ = uVar213;
              auVar207._20_4_ = uVar213;
              auVar207._24_4_ = uVar213;
              auVar207._28_4_ = uVar213;
              uVar213 = *(undefined4 *)(uVar115 + 0x60 + lVar117);
              auVar25._4_4_ = uVar213;
              auVar25._0_4_ = uVar213;
              auVar25._8_4_ = uVar213;
              auVar25._12_4_ = uVar213;
              auVar25._16_4_ = uVar213;
              auVar25._20_4_ = uVar213;
              auVar25._24_4_ = uVar213;
              auVar25._28_4_ = uVar213;
              auVar136 = vfmadd213ps_avx512vl(auVar207,auVar133,auVar25);
              uVar213 = *(undefined4 *)(uVar115 + 0xe0 + lVar117);
              auVar209._4_4_ = uVar213;
              auVar209._0_4_ = uVar213;
              auVar209._8_4_ = uVar213;
              auVar209._12_4_ = uVar213;
              auVar209._16_4_ = uVar213;
              auVar209._20_4_ = uVar213;
              auVar209._24_4_ = uVar213;
              auVar209._28_4_ = uVar213;
              uVar213 = *(undefined4 *)(uVar115 + 0x80 + lVar117);
              auVar26._4_4_ = uVar213;
              auVar26._0_4_ = uVar213;
              auVar26._8_4_ = uVar213;
              auVar26._12_4_ = uVar213;
              auVar26._16_4_ = uVar213;
              auVar26._20_4_ = uVar213;
              auVar26._24_4_ = uVar213;
              auVar26._28_4_ = uVar213;
              auVar137 = vfmadd213ps_avx512vl(auVar209,auVar133,auVar26);
              in_ZMM11 = ZEXT3264(local_2740);
              auVar73._4_4_ = fStack_271c;
              auVar73._0_4_ = local_2720;
              auVar73._8_4_ = fStack_2718;
              auVar73._12_4_ = fStack_2714;
              auVar73._16_4_ = fStack_2710;
              auVar73._20_4_ = fStack_270c;
              auVar73._24_4_ = fStack_2708;
              auVar73._28_4_ = uStack_2704;
              in_ZMM12 = ZEXT3264(auVar73);
              auVar128 = vfmsub213ps_fma(auVar134,local_2780,auVar73);
              auVar74._4_4_ = fStack_26fc;
              auVar74._0_4_ = local_2700;
              auVar74._8_4_ = fStack_26f8;
              auVar74._12_4_ = fStack_26f4;
              auVar74._16_4_ = fStack_26f0;
              auVar74._20_4_ = fStack_26ec;
              auVar74._24_4_ = fStack_26e8;
              auVar74._28_4_ = uStack_26e4;
              in_ZMM13 = ZEXT3264(auVar74);
              auVar129 = vfmsub213ps_fma(auVar131,local_2760,auVar74);
              in_ZMM14 = ZEXT3264(local_26e0);
              auVar157 = vfmsub213ps_fma(auVar132,local_2740,local_26e0);
              auVar164 = vfmsub213ps_fma(auVar135,local_2780,auVar73);
              auVar206 = ZEXT1664(auVar164);
              auVar200 = vfmsub213ps_fma(auVar136,local_2760,auVar74);
              auVar19 = vfmsub213ps_fma(auVar137,local_2740,local_26e0);
              auVar134 = vpminsd_avx2(ZEXT1632(auVar128),ZEXT1632(auVar164));
              auVar131 = vpminsd_avx2(ZEXT1632(auVar129),ZEXT1632(auVar200));
              auVar134 = vpmaxsd_avx2(auVar134,auVar131);
              auVar131 = vpminsd_avx2(ZEXT1632(auVar157),ZEXT1632(auVar19));
              in_ZMM10 = ZEXT3264(auVar131);
              auVar134 = vpmaxsd_avx2(auVar134,auVar131);
              auVar131 = vpmaxsd_avx2(ZEXT1632(auVar128),ZEXT1632(auVar164));
              auVar132 = vpmaxsd_avx2(ZEXT1632(auVar129),ZEXT1632(auVar200));
              auVar132 = vpminsd_avx2(auVar131,auVar132);
              auVar131 = vpmaxsd_avx2(ZEXT1632(auVar157),ZEXT1632(auVar19));
              auVar132 = vpminsd_avx2(auVar132,auVar131);
              auVar131 = vpmaxsd_avx2(auVar134,local_2660);
              auVar183 = ZEXT3264(auVar131);
              auVar132 = vpminsd_avx2(auVar132,local_2640);
              uVar127 = vcmpps_avx512vl(auVar131,auVar132,2);
              if ((uVar214 & 7) == 6) {
                uVar213 = *(undefined4 *)(uVar115 + 0xf0 + lVar117);
                auVar27._4_4_ = uVar213;
                auVar27._0_4_ = uVar213;
                auVar27._8_4_ = uVar213;
                auVar27._12_4_ = uVar213;
                auVar27._16_4_ = uVar213;
                auVar27._20_4_ = uVar213;
                auVar27._24_4_ = uVar213;
                auVar27._28_4_ = uVar213;
                uVar121 = vcmpps_avx512vl(auVar133,auVar27,0xd);
                uVar213 = *(undefined4 *)(uVar115 + 0x100 + lVar117);
                auVar28._4_4_ = uVar213;
                auVar28._0_4_ = uVar213;
                auVar28._8_4_ = uVar213;
                auVar28._12_4_ = uVar213;
                auVar28._16_4_ = uVar213;
                auVar28._20_4_ = uVar213;
                auVar28._24_4_ = uVar213;
                auVar28._28_4_ = uVar213;
                uVar16 = vcmpps_avx512vl(auVar133,auVar28,1);
                uVar127 = uVar127 & uVar121 & uVar16;
              }
              uVar121 = vcmpps_avx512vl(local_2640,auVar223._0_32_,6);
              uVar127 = uVar127 & uVar121;
              uVar121 = root.ptr;
              auVar138 = auVar130;
              if ((byte)uVar127 != 0) {
                auVar134 = vblendmps_avx512vl(auVar227._0_32_,auVar134);
                bVar112 = (bool)((byte)uVar127 & 1);
                auVar138._0_4_ = (uint)bVar112 * auVar134._0_4_ | (uint)!bVar112 * auVar133._0_4_;
                bVar112 = (bool)((byte)(uVar127 >> 1) & 1);
                auVar138._4_4_ = (uint)bVar112 * auVar134._4_4_ | (uint)!bVar112 * auVar133._4_4_;
                bVar112 = (bool)((byte)(uVar127 >> 2) & 1);
                auVar138._8_4_ = (uint)bVar112 * auVar134._8_4_ | (uint)!bVar112 * auVar133._8_4_;
                bVar112 = (bool)((byte)(uVar127 >> 3) & 1);
                auVar138._12_4_ = (uint)bVar112 * auVar134._12_4_ | (uint)!bVar112 * auVar133._12_4_
                ;
                bVar112 = (bool)((byte)(uVar127 >> 4) & 1);
                auVar138._16_4_ = (uint)bVar112 * auVar134._16_4_ | (uint)!bVar112 * auVar133._16_4_
                ;
                bVar112 = (bool)((byte)(uVar127 >> 5) & 1);
                auVar138._20_4_ = (uint)bVar112 * auVar134._20_4_ | (uint)!bVar112 * auVar133._20_4_
                ;
                bVar112 = (bool)((byte)(uVar127 >> 6) & 1);
                auVar138._24_4_ = (uint)bVar112 * auVar134._24_4_ | (uint)!bVar112 * auVar133._24_4_
                ;
                bVar112 = SUB81(uVar127 >> 7,0);
                auVar138._28_4_ = (uint)bVar112 * auVar134._28_4_ | (uint)!bVar112 * auVar133._28_4_
                ;
                uVar121 = uVar114;
                if (root.ptr != 8) {
                  *puVar124 = root.ptr;
                  puVar124 = puVar124 + 1;
                  *pauVar120 = auVar130;
                  pauVar120 = pauVar120 + 1;
                }
              }
              auVar130 = auVar138;
              root.ptr = uVar121;
            }
            if (root.ptr == 8) goto LAB_01d09913;
            uVar17 = vcmpps_avx512vl(auVar130,local_2640,9);
            auVar223 = ZEXT3264(auVar130);
          } while ((byte)uVar126 < (byte)POPCOUNT((int)uVar17));
          *puVar124 = root.ptr;
          puVar124 = puVar124 + 1;
          *pauVar120 = auVar130;
          pauVar120 = pauVar120 + 1;
LAB_01d09913:
          iVar113 = 4;
        }
        else {
          local_2b40._0_8_ = uVar114;
          while (bVar111 = (byte)local_2c54, uVar115 != 0) {
            k = 0;
            for (uVar126 = uVar115; (uVar126 & 1) == 0; uVar126 = uVar126 >> 1 | 0x8000000000000000)
            {
              k = k + 1;
            }
            uVar115 = uVar115 - 1 & uVar115;
            auVar183 = ZEXT1664(auVar183._0_16_);
            auVar206 = ZEXT1664(auVar206._0_16_);
            in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
            in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            bVar112 = occluded1(local_2ad8,bvh,root,k,&local_2c09,ray,
                                (TravRayK<8,_false> *)&local_2840.field_0,context);
            bVar116 = (byte)(1 << ((uint)k & 0x1f));
            if (!bVar112) {
              bVar116 = 0;
            }
            local_2c54 = (uint)(bVar111 | bVar116);
          }
          iVar113 = 3;
          auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          auVar224 = ZEXT3264(auVar130);
          auVar130 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar225 = ZEXT3264(auVar130);
          auVar130 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
          auVar226 = ZEXT3264(auVar130);
          auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar227 = ZEXT3264(auVar130);
          auVar128 = vxorps_avx512vl(auVar228._0_16_,auVar228._0_16_);
          auVar228 = ZEXT1664(auVar128);
          auVar130 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar229 = ZEXT3264(auVar130);
          auVar223 = ZEXT3264(local_2b20);
          if (bVar111 != 0xff) {
            auVar130 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            local_2640._0_4_ =
                 (uint)(bVar111 & 1) * auVar130._0_4_ |
                 (uint)!(bool)(bVar111 & 1) * local_2640._0_4_;
            bVar112 = (bool)((byte)(local_2c54 >> 1) & 1);
            local_2640._4_4_ = (uint)bVar112 * auVar130._4_4_ | (uint)!bVar112 * local_2640._4_4_;
            bVar112 = (bool)((byte)(local_2c54 >> 2) & 1);
            local_2640._8_4_ = (uint)bVar112 * auVar130._8_4_ | (uint)!bVar112 * local_2640._8_4_;
            bVar112 = (bool)((byte)(local_2c54 >> 3) & 1);
            local_2640._12_4_ = (uint)bVar112 * auVar130._12_4_ | (uint)!bVar112 * local_2640._12_4_
            ;
            bVar112 = (bool)((byte)(local_2c54 >> 4) & 1);
            local_2640._16_4_ = (uint)bVar112 * auVar130._16_4_ | (uint)!bVar112 * local_2640._16_4_
            ;
            bVar112 = (bool)((byte)(local_2c54 >> 5) & 1);
            local_2640._20_4_ = (uint)bVar112 * auVar130._20_4_ | (uint)!bVar112 * local_2640._20_4_
            ;
            bVar112 = (bool)((byte)(local_2c54 >> 6) & 1);
            local_2640._24_4_ = (uint)bVar112 * auVar130._24_4_ | (uint)!bVar112 * local_2640._24_4_
            ;
            local_2640._28_4_ =
                 (local_2c54 >> 7) * auVar130._28_4_ |
                 (uint)!SUB41(local_2c54 >> 7,0) * local_2640._28_4_;
            iVar113 = 2;
          }
          uVar126 = local_2bc0;
          if ((uint)local_2bc0 < (uint)local_2b40._0_4_) goto LAB_01d09728;
        }
        auVar130 = auVar226._0_32_;
      } while (iVar113 != 3);
LAB_01d0ab9c:
      local_2bac._0_1_ = (byte)local_2c54 & (byte)local_2bac;
      bVar112 = (bool)((byte)local_2bac >> 1 & 1);
      bVar8 = (bool)((byte)local_2bac >> 2 & 1);
      bVar9 = (bool)((byte)local_2bac >> 3 & 1);
      bVar10 = (bool)((byte)local_2bac >> 4 & 1);
      bVar11 = (bool)((byte)local_2bac >> 5 & 1);
      bVar12 = (bool)((byte)local_2bac >> 6 & 1);
      *(uint *)local_2bb8 =
           (uint)((byte)local_2bac & 1) * auVar130._0_4_ |
           (uint)!(bool)((byte)local_2bac & 1) * *(int *)local_2bb8;
      *(uint *)(local_2bb8 + 4) =
           (uint)bVar112 * auVar130._4_4_ | (uint)!bVar112 * *(int *)(local_2bb8 + 4);
      *(uint *)(local_2bb8 + 8) =
           (uint)bVar8 * auVar130._8_4_ | (uint)!bVar8 * *(int *)(local_2bb8 + 8);
      *(uint *)(local_2bb8 + 0xc) =
           (uint)bVar9 * auVar130._12_4_ | (uint)!bVar9 * *(int *)(local_2bb8 + 0xc);
      *(uint *)(local_2bb8 + 0x10) =
           (uint)bVar10 * auVar130._16_4_ | (uint)!bVar10 * *(int *)(local_2bb8 + 0x10);
      *(uint *)(local_2bb8 + 0x14) =
           (uint)bVar11 * auVar130._20_4_ | (uint)!bVar11 * *(int *)(local_2bb8 + 0x14);
      *(uint *)(local_2bb8 + 0x18) =
           (uint)bVar12 * auVar130._24_4_ | (uint)!bVar12 * *(int *)(local_2bb8 + 0x18);
      *(uint *)(local_2bb8 + 0x1c) =
           (uint)((byte)local_2bac >> 7) * auVar130._28_4_ |
           (uint)!(bool)((byte)local_2bac >> 7) * *(int *)(local_2bb8 + 0x1c);
    }
  }
  return;
LAB_01d09961:
  do {
    if (lVar117 == local_2ad0) goto LAB_01d0aa42;
    lVar122 = lVar117 * 0x60 + (root.ptr & 0xfffffffffffffff0);
    local_2c08 = 0;
    for (uVar115 = (ulong)bVar111; (uVar115 & 1) == 0; uVar115 = uVar115 >> 1 | 0x8000000000000000)
    {
      local_2c08 = local_2c08 + 1;
    }
    local_2bc8 = (ulong)bVar111;
    lVar123 = 0;
    bVar116 = bVar111;
    do {
      auVar128 = auVar228._0_16_;
      auVar223._28_36_ = in_ZMM13._28_36_;
      if ((lVar123 == 4) || (iVar113 = *(int *)(lVar122 + 0x50 + lVar123 * 4), iVar113 == -1))
      goto LAB_01d0aa27;
      local_28c0._0_4_ = iVar113;
      local_2ac8 = (ulong)*(uint *)(lVar122 + 0x40 + lVar123 * 4);
      pGVar5 = (context->scene->geometries).items[local_2ac8].ptr;
      BVar1 = pGVar5->time_range;
      auVar157._8_8_ = 0;
      auVar157._0_4_ = BVar1.lower;
      auVar157._4_4_ = BVar1.upper;
      fVar211 = pGVar5->fnumTimeSegments;
      auVar164._4_4_ = fVar211;
      auVar164._0_4_ = fVar211;
      auVar164._8_4_ = fVar211;
      auVar164._12_4_ = fVar211;
      fVar155 = BVar1.lower;
      auVar137._4_4_ = fVar155;
      auVar137._0_4_ = fVar155;
      auVar137._8_4_ = fVar155;
      auVar137._12_4_ = fVar155;
      auVar137._16_4_ = fVar155;
      auVar137._20_4_ = fVar155;
      auVar137._24_4_ = fVar155;
      auVar137._28_4_ = fVar155;
      auVar130 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar137);
      auVar129 = vmovshdup_avx(auVar157);
      auVar129 = vsubps_avx(auVar129,auVar157);
      auVar135._0_4_ = auVar129._0_4_;
      auVar135._4_4_ = auVar135._0_4_;
      auVar135._8_4_ = auVar135._0_4_;
      auVar135._12_4_ = auVar135._0_4_;
      auVar135._16_4_ = auVar135._0_4_;
      auVar135._20_4_ = auVar135._0_4_;
      auVar135._24_4_ = auVar135._0_4_;
      auVar135._28_4_ = auVar135._0_4_;
      auVar130 = vdivps_avx(auVar130,auVar135);
      auVar132._4_4_ = fVar211 * auVar130._4_4_;
      auVar132._0_4_ = fVar211 * auVar130._0_4_;
      auVar132._8_4_ = fVar211 * auVar130._8_4_;
      auVar132._12_4_ = fVar211 * auVar130._12_4_;
      auVar132._16_4_ = fVar211 * auVar130._16_4_;
      auVar132._20_4_ = fVar211 * auVar130._20_4_;
      auVar132._24_4_ = fVar211 * auVar130._24_4_;
      auVar132._28_4_ = auVar130._28_4_;
      auVar130 = vroundps_avx(auVar132,1);
      auVar129 = vaddss_avx512f(auVar164,SUB6416(ZEXT464(0xbf800000),0));
      auVar136._0_4_ = auVar129._0_4_;
      auVar136._4_4_ = auVar136._0_4_;
      auVar136._8_4_ = auVar136._0_4_;
      auVar136._12_4_ = auVar136._0_4_;
      auVar136._16_4_ = auVar136._0_4_;
      auVar136._20_4_ = auVar136._0_4_;
      auVar136._24_4_ = auVar136._0_4_;
      auVar136._28_4_ = auVar136._0_4_;
      auVar130 = vminps_avx(auVar130,auVar136);
      auVar131 = auVar228._0_32_;
      auVar133 = vmaxps_avx512vl(auVar130,auVar131);
      auVar130 = vcvtps2dq_avx(auVar133);
      local_2c00.valid = (int *)auVar130._0_8_;
      local_2c00.geometryUserPtr = (void *)auVar130._8_8_;
      local_2c00.context = (RTCRayQueryContext *)auVar130._16_8_;
      local_2c00.ray = (RTCRayN *)auVar130._24_8_;
      auVar133 = vsubps_avx(auVar132,auVar133);
      auVar134 = vpbroadcastd_avx512vl();
      auVar166 = ZEXT3264(auVar134);
      uVar17 = vpcmpeqd_avx512vl(auVar134,auVar130);
      uVar115 = local_2bc8;
      uVar126 = local_2c08;
      if ((byte)((byte)uVar17 | ~bVar111) == 0xff) {
        lVar118 = (long)*(int *)((long)&local_2c00.valid + local_2c08 * 4) * 0x38;
        lVar119 = *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar118);
        lVar118 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar118);
        uVar126 = (ulong)*(uint *)(lVar122 + lVar123 * 4);
        uVar115 = (ulong)*(uint *)(lVar122 + 0x10 + lVar123 * 4);
        auVar139 = vsubps_avx512vl(auVar225._0_32_,auVar133);
        uVar213 = *(undefined4 *)(lVar118 + uVar126 * 4);
        auVar29._4_4_ = uVar213;
        auVar29._0_4_ = uVar213;
        auVar29._8_4_ = uVar213;
        auVar29._12_4_ = uVar213;
        auVar29._16_4_ = uVar213;
        auVar29._20_4_ = uVar213;
        auVar29._24_4_ = uVar213;
        auVar29._28_4_ = uVar213;
        auVar130 = vmulps_avx512vl(auVar133,auVar29);
        uVar213 = *(undefined4 *)(lVar118 + 4 + uVar126 * 4);
        auVar30._4_4_ = uVar213;
        auVar30._0_4_ = uVar213;
        auVar30._8_4_ = uVar213;
        auVar30._12_4_ = uVar213;
        auVar30._16_4_ = uVar213;
        auVar30._20_4_ = uVar213;
        auVar30._24_4_ = uVar213;
        auVar30._28_4_ = uVar213;
        auVar134 = vmulps_avx512vl(auVar133,auVar30);
        uVar213 = *(undefined4 *)(lVar118 + 8 + uVar126 * 4);
        auVar31._4_4_ = uVar213;
        auVar31._0_4_ = uVar213;
        auVar31._8_4_ = uVar213;
        auVar31._12_4_ = uVar213;
        auVar31._16_4_ = uVar213;
        auVar31._20_4_ = uVar213;
        auVar31._24_4_ = uVar213;
        auVar31._28_4_ = uVar213;
        auVar132 = vmulps_avx512vl(auVar133,auVar31);
        uVar213 = *(undefined4 *)(lVar119 + uVar126 * 4);
        auVar32._4_4_ = uVar213;
        auVar32._0_4_ = uVar213;
        auVar32._8_4_ = uVar213;
        auVar32._12_4_ = uVar213;
        auVar32._16_4_ = uVar213;
        auVar32._20_4_ = uVar213;
        auVar32._24_4_ = uVar213;
        auVar32._28_4_ = uVar213;
        auVar140 = vfmadd231ps_avx512vl(auVar130,auVar139,auVar32);
        uVar213 = *(undefined4 *)(lVar119 + 4 + uVar126 * 4);
        auVar33._4_4_ = uVar213;
        auVar33._0_4_ = uVar213;
        auVar33._8_4_ = uVar213;
        auVar33._12_4_ = uVar213;
        auVar33._16_4_ = uVar213;
        auVar33._20_4_ = uVar213;
        auVar33._24_4_ = uVar213;
        auVar33._28_4_ = uVar213;
        auVar141 = vfmadd231ps_avx512vl(auVar134,auVar139,auVar33);
        uVar213 = *(undefined4 *)(lVar119 + 8 + uVar126 * 4);
        auVar34._4_4_ = uVar213;
        auVar34._0_4_ = uVar213;
        auVar34._8_4_ = uVar213;
        auVar34._12_4_ = uVar213;
        auVar34._16_4_ = uVar213;
        auVar34._20_4_ = uVar213;
        auVar34._24_4_ = uVar213;
        auVar34._28_4_ = uVar213;
        auVar142 = vfmadd231ps_avx512vl(auVar132,auVar139,auVar34);
        uVar213 = *(undefined4 *)(lVar118 + uVar115 * 4);
        auVar35._4_4_ = uVar213;
        auVar35._0_4_ = uVar213;
        auVar35._8_4_ = uVar213;
        auVar35._12_4_ = uVar213;
        auVar35._16_4_ = uVar213;
        auVar35._20_4_ = uVar213;
        auVar35._24_4_ = uVar213;
        auVar35._28_4_ = uVar213;
        auVar130 = vmulps_avx512vl(auVar133,auVar35);
        uVar213 = *(undefined4 *)(lVar118 + 4 + uVar115 * 4);
        auVar36._4_4_ = uVar213;
        auVar36._0_4_ = uVar213;
        auVar36._8_4_ = uVar213;
        auVar36._12_4_ = uVar213;
        auVar36._16_4_ = uVar213;
        auVar36._20_4_ = uVar213;
        auVar36._24_4_ = uVar213;
        auVar36._28_4_ = uVar213;
        auVar134 = vmulps_avx512vl(auVar133,auVar36);
        uVar213 = *(undefined4 *)(lVar118 + 8 + uVar115 * 4);
        auVar37._4_4_ = uVar213;
        auVar37._0_4_ = uVar213;
        auVar37._8_4_ = uVar213;
        auVar37._12_4_ = uVar213;
        auVar37._16_4_ = uVar213;
        auVar37._20_4_ = uVar213;
        auVar37._24_4_ = uVar213;
        auVar37._28_4_ = uVar213;
        auVar132 = vmulps_avx512vl(auVar133,auVar37);
        uVar213 = *(undefined4 *)(lVar119 + uVar115 * 4);
        auVar38._4_4_ = uVar213;
        auVar38._0_4_ = uVar213;
        auVar38._8_4_ = uVar213;
        auVar38._12_4_ = uVar213;
        auVar38._16_4_ = uVar213;
        auVar38._20_4_ = uVar213;
        auVar38._24_4_ = uVar213;
        auVar38._28_4_ = uVar213;
        auVar135 = vfmadd231ps_avx512vl(auVar130,auVar139,auVar38);
        uVar213 = *(undefined4 *)(lVar119 + 4 + uVar115 * 4);
        auVar39._4_4_ = uVar213;
        auVar39._0_4_ = uVar213;
        auVar39._8_4_ = uVar213;
        auVar39._12_4_ = uVar213;
        auVar39._16_4_ = uVar213;
        auVar39._20_4_ = uVar213;
        auVar39._24_4_ = uVar213;
        auVar39._28_4_ = uVar213;
        auVar134 = vfmadd231ps_avx512vl(auVar134,auVar139,auVar39);
        uVar213 = *(undefined4 *)(lVar119 + 8 + uVar115 * 4);
        auVar40._4_4_ = uVar213;
        auVar40._0_4_ = uVar213;
        auVar40._8_4_ = uVar213;
        auVar40._12_4_ = uVar213;
        auVar40._16_4_ = uVar213;
        auVar40._20_4_ = uVar213;
        auVar40._24_4_ = uVar213;
        auVar40._28_4_ = uVar213;
        auVar143 = vfmadd231ps_avx512vl(auVar132,auVar139,auVar40);
        uVar126 = (ulong)*(uint *)(lVar122 + 0x20 + lVar123 * 4);
        uVar213 = *(undefined4 *)(lVar118 + uVar126 * 4);
        auVar41._4_4_ = uVar213;
        auVar41._0_4_ = uVar213;
        auVar41._8_4_ = uVar213;
        auVar41._12_4_ = uVar213;
        auVar41._16_4_ = uVar213;
        auVar41._20_4_ = uVar213;
        auVar41._24_4_ = uVar213;
        auVar41._28_4_ = uVar213;
        auVar130 = vmulps_avx512vl(auVar133,auVar41);
        uVar213 = *(undefined4 *)(lVar118 + 4 + uVar126 * 4);
        auVar42._4_4_ = uVar213;
        auVar42._0_4_ = uVar213;
        auVar42._8_4_ = uVar213;
        auVar42._12_4_ = uVar213;
        auVar42._16_4_ = uVar213;
        auVar42._20_4_ = uVar213;
        auVar42._24_4_ = uVar213;
        auVar42._28_4_ = uVar213;
        auVar132 = vmulps_avx512vl(auVar133,auVar42);
        uVar213 = *(undefined4 *)(lVar118 + 8 + uVar126 * 4);
        auVar43._4_4_ = uVar213;
        auVar43._0_4_ = uVar213;
        auVar43._8_4_ = uVar213;
        auVar43._12_4_ = uVar213;
        auVar43._16_4_ = uVar213;
        auVar43._20_4_ = uVar213;
        auVar43._24_4_ = uVar213;
        auVar43._28_4_ = uVar213;
        auVar137 = vmulps_avx512vl(auVar133,auVar43);
        uVar213 = *(undefined4 *)(lVar119 + uVar126 * 4);
        auVar44._4_4_ = uVar213;
        auVar44._0_4_ = uVar213;
        auVar44._8_4_ = uVar213;
        auVar44._12_4_ = uVar213;
        auVar44._16_4_ = uVar213;
        auVar44._20_4_ = uVar213;
        auVar44._24_4_ = uVar213;
        auVar44._28_4_ = uVar213;
        auVar136 = vfmadd231ps_avx512vl(auVar130,auVar139,auVar44);
        uVar213 = *(undefined4 *)(lVar119 + 4 + uVar126 * 4);
        auVar45._4_4_ = uVar213;
        auVar45._0_4_ = uVar213;
        auVar45._8_4_ = uVar213;
        auVar45._12_4_ = uVar213;
        auVar45._16_4_ = uVar213;
        auVar45._20_4_ = uVar213;
        auVar45._24_4_ = uVar213;
        auVar45._28_4_ = uVar213;
        auVar132 = vfmadd231ps_avx512vl(auVar132,auVar139,auVar45);
        uVar213 = *(undefined4 *)(lVar119 + 8 + uVar126 * 4);
        auVar46._4_4_ = uVar213;
        auVar46._0_4_ = uVar213;
        auVar46._8_4_ = uVar213;
        auVar46._12_4_ = uVar213;
        auVar46._16_4_ = uVar213;
        auVar46._20_4_ = uVar213;
        auVar46._24_4_ = uVar213;
        auVar46._28_4_ = uVar213;
        auVar144 = vfmadd231ps_avx512vl(auVar137,auVar139,auVar46);
        uVar126 = (ulong)*(uint *)(lVar122 + 0x30 + lVar123 * 4);
        uVar213 = *(undefined4 *)(lVar118 + uVar126 * 4);
        auVar47._4_4_ = uVar213;
        auVar47._0_4_ = uVar213;
        auVar47._8_4_ = uVar213;
        auVar47._12_4_ = uVar213;
        auVar47._16_4_ = uVar213;
        auVar47._20_4_ = uVar213;
        auVar47._24_4_ = uVar213;
        auVar47._28_4_ = uVar213;
        auVar130 = vmulps_avx512vl(auVar133,auVar47);
        uVar213 = *(undefined4 *)(lVar118 + 4 + uVar126 * 4);
        auVar48._4_4_ = uVar213;
        auVar48._0_4_ = uVar213;
        auVar48._8_4_ = uVar213;
        auVar48._12_4_ = uVar213;
        auVar48._16_4_ = uVar213;
        auVar48._20_4_ = uVar213;
        auVar48._24_4_ = uVar213;
        auVar48._28_4_ = uVar213;
        auVar145 = vmulps_avx512vl(auVar133,auVar48);
        uVar213 = *(undefined4 *)(lVar118 + 8 + uVar126 * 4);
        auVar49._4_4_ = uVar213;
        auVar49._0_4_ = uVar213;
        auVar49._8_4_ = uVar213;
        auVar49._12_4_ = uVar213;
        auVar49._16_4_ = uVar213;
        auVar49._20_4_ = uVar213;
        auVar49._24_4_ = uVar213;
        auVar49._28_4_ = uVar213;
        auVar133 = vmulps_avx512vl(auVar133,auVar49);
        uVar213 = *(undefined4 *)(lVar119 + uVar126 * 4);
        auVar50._4_4_ = uVar213;
        auVar50._0_4_ = uVar213;
        auVar50._8_4_ = uVar213;
        auVar50._12_4_ = uVar213;
        auVar50._16_4_ = uVar213;
        auVar50._20_4_ = uVar213;
        auVar50._24_4_ = uVar213;
        auVar50._28_4_ = uVar213;
        auVar137 = vfmadd231ps_avx512vl(auVar130,auVar139,auVar50);
        uVar213 = *(undefined4 *)(lVar119 + 4 + uVar126 * 4);
        auVar51._4_4_ = uVar213;
        auVar51._0_4_ = uVar213;
        auVar51._8_4_ = uVar213;
        auVar51._12_4_ = uVar213;
        auVar51._16_4_ = uVar213;
        auVar51._20_4_ = uVar213;
        auVar51._24_4_ = uVar213;
        auVar51._28_4_ = uVar213;
        local_2b40 = vfmadd231ps_avx512vl(auVar145,auVar139,auVar51);
        uVar213 = *(undefined4 *)(lVar119 + 8 + uVar126 * 4);
        auVar52._4_4_ = uVar213;
        auVar52._0_4_ = uVar213;
        auVar52._8_4_ = uVar213;
        auVar52._12_4_ = uVar213;
        auVar52._16_4_ = uVar213;
        auVar52._20_4_ = uVar213;
        auVar52._24_4_ = uVar213;
        auVar52._28_4_ = uVar213;
        local_2b20 = vfmadd231ps_avx512vl(auVar133,auVar139,auVar52);
      }
      else {
        while (fVar195 = fStack_2b88, fVar194 = fStack_2b8c, fVar193 = fStack_2b90,
              fVar190 = local_2ba0[3], fVar212 = local_2ba0[2], fVar155 = local_2ba0[1],
              fVar211 = local_2ba0[0], uVar115 != 0) {
          lVar119 = (long)*(int *)((long)&local_2c00.valid + uVar126 * 4) * 0x38;
          uVar114 = (ulong)*(uint *)(lVar122 + lVar123 * 4);
          auVar129 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar5[2].numPrimitives + lVar119) + uVar114 * 4);
          auVar166 = ZEXT1664(auVar129);
          auVar157 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar119) + uVar114 * 4);
          *(int *)((long)&local_2ac0 + uVar126 * 4) = auVar129._0_4_;
          uVar213 = vextractps_avx(auVar129,1);
          *(undefined4 *)((long)&local_2ac0 + uVar126 * 4 + 0x20) = uVar213;
          uVar213 = vextractps_avx(auVar129,2);
          *(undefined4 *)((long)&local_2ac0 + uVar126 * 4 + 0x40) = uVar213;
          local_2ba0[uVar126] = auVar157._0_4_;
          fVar211 = (float)vextractps_avx(auVar157,1);
          local_2b80[uVar126] = fVar211;
          fVar211 = (float)vextractps_avx(auVar157,2);
          local_2b60[uVar126] = fVar211;
          uVar114 = uVar126 & 0x3f;
          uVar126 = 0;
          uVar115 = uVar115 ^ 1L << uVar114;
          for (uVar114 = uVar115; (uVar114 & 1) == 0; uVar114 = uVar114 >> 1 | 0x8000000000000000) {
            uVar126 = uVar126 + 1;
          }
        }
        auVar130 = vsubps_avx512vl(auVar225._0_32_,auVar133);
        uVar213 = local_2ac0._0_4_;
        uVar82 = local_2ac0._4_4_;
        uVar84 = local_2ac0._8_4_;
        uVar86 = local_2ac0._12_4_;
        uVar88 = local_2ac0._16_4_;
        uVar90 = local_2ac0._20_4_;
        uVar92 = local_2ac0._24_4_;
        uVar94 = local_2ac0._28_4_;
        uVar95 = local_2ac0._64_4_;
        uVar97 = local_2ac0._68_4_;
        uVar99 = local_2ac0._72_4_;
        uVar101 = local_2ac0._76_4_;
        uVar103 = local_2ac0._80_4_;
        uVar105 = local_2ac0._84_4_;
        uVar107 = local_2ac0._88_4_;
        uVar109 = local_2ac0._92_4_;
        fVar173 = auVar130._0_4_;
        fVar174 = auVar130._4_4_;
        fVar175 = auVar130._8_4_;
        fVar176 = auVar130._12_4_;
        fVar177 = auVar130._16_4_;
        fVar178 = auVar130._20_4_;
        fVar179 = auVar130._24_4_;
        fVar156 = auVar133._0_4_;
        fVar158 = auVar133._4_4_;
        fVar159 = auVar133._8_4_;
        fVar160 = auVar133._12_4_;
        fVar161 = auVar133._16_4_;
        fVar162 = auVar133._20_4_;
        fVar163 = auVar133._24_4_;
        auVar141._0_4_ = fVar173 * (float)local_2ac0._32_4_ + fVar156 * local_2b80[0];
        auVar141._4_4_ = fVar174 * (float)local_2ac0._36_4_ + fVar158 * local_2b80[1];
        auVar141._8_4_ = fVar175 * (float)local_2ac0._40_4_ + fVar159 * local_2b80[2];
        auVar141._12_4_ = fVar176 * (float)local_2ac0._44_4_ + fVar160 * local_2b80[3];
        auVar141._16_4_ = fVar177 * (float)local_2ac0._48_4_ + fVar161 * fStack_2b70;
        auVar141._20_4_ = fVar178 * (float)local_2ac0._52_4_ + fVar162 * fStack_2b6c;
        auVar141._24_4_ = fVar179 * (float)local_2ac0._56_4_ + fVar163 * fStack_2b68;
        fVar196 = auVar183._28_4_;
        auVar141._28_4_ = auVar166._28_4_ + fVar196;
        fVar180 = fVar156 * local_2b60[0];
        fVar184 = fVar158 * local_2b60[1];
        fVar185 = fVar159 * local_2b60[2];
        fVar186 = fVar160 * local_2b60[3];
        fVar187 = fVar161 * fStack_2b50;
        fVar188 = fVar162 * fStack_2b4c;
        fVar189 = fVar163 * fStack_2b48;
        uVar115 = local_2bc8;
        uVar126 = local_2c08;
        while (fVar80 = fStack_2b88, fVar79 = fStack_2b8c, fVar78 = fStack_2b90,
              fVar77 = local_2ba0[3], fVar76 = local_2ba0[2], fVar75 = local_2ba0[1],
              fVar3 = local_2ba0[0], uVar115 != 0) {
          lVar119 = (long)*(int *)((long)&local_2c00.valid + uVar126 * 4) * 0x38;
          uVar114 = (ulong)*(uint *)(lVar122 + 0x10 + lVar123 * 4);
          auVar129 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar5[2].numPrimitives + lVar119) + uVar114 * 4);
          auVar206 = ZEXT1664(auVar129);
          auVar157 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar119) + uVar114 * 4);
          *(int *)((long)&local_2ac0 + uVar126 * 4) = auVar129._0_4_;
          uVar2 = vextractps_avx(auVar129,1);
          *(undefined4 *)((long)&local_2ac0 + uVar126 * 4 + 0x20) = uVar2;
          uVar2 = vextractps_avx(auVar129,2);
          *(undefined4 *)((long)&local_2ac0 + uVar126 * 4 + 0x40) = uVar2;
          local_2ba0[uVar126] = auVar157._0_4_;
          fVar3 = (float)vextractps_avx(auVar157,1);
          local_2b80[uVar126] = fVar3;
          fVar3 = (float)vextractps_avx(auVar157,2);
          local_2b60[uVar126] = fVar3;
          uVar114 = uVar126 & 0x3f;
          uVar126 = 0;
          uVar115 = uVar115 ^ 1L << uVar114;
          for (uVar114 = uVar115; (uVar114 & 1) == 0; uVar114 = uVar114 >> 1 | 0x8000000000000000) {
            uVar126 = uVar126 + 1;
          }
        }
        uVar2 = local_2ac0._0_4_;
        uVar83 = local_2ac0._4_4_;
        uVar85 = local_2ac0._8_4_;
        uVar87 = local_2ac0._12_4_;
        uVar89 = local_2ac0._16_4_;
        uVar91 = local_2ac0._20_4_;
        uVar93 = local_2ac0._24_4_;
        uVar96 = local_2ac0._64_4_;
        uVar98 = local_2ac0._68_4_;
        uVar100 = local_2ac0._72_4_;
        uVar102 = local_2ac0._76_4_;
        uVar104 = local_2ac0._80_4_;
        uVar106 = local_2ac0._84_4_;
        uVar108 = local_2ac0._88_4_;
        uVar110 = local_2ac0._92_4_;
        auVar183._0_4_ = fVar173 * (float)local_2ac0._32_4_;
        auVar183._4_4_ = fVar174 * (float)local_2ac0._36_4_;
        auVar183._8_4_ = fVar175 * (float)local_2ac0._40_4_;
        auVar183._12_4_ = fVar176 * (float)local_2ac0._44_4_;
        auVar183._16_4_ = fVar177 * (float)local_2ac0._48_4_;
        auVar183._20_4_ = fVar178 * (float)local_2ac0._52_4_;
        auVar183._28_36_ = in_ZMM10._28_36_;
        auVar183._24_4_ = fVar179 * (float)local_2ac0._56_4_;
        auVar140._0_4_ = fVar173 * (float)uVar213 + fVar156 * fVar211;
        auVar140._4_4_ = fVar174 * (float)uVar82 + fVar158 * fVar155;
        auVar140._8_4_ = fVar175 * (float)uVar84 + fVar159 * fVar212;
        auVar140._12_4_ = fVar176 * (float)uVar86 + fVar160 * fVar190;
        auVar140._16_4_ = fVar177 * (float)uVar88 + fVar161 * fVar193;
        auVar140._20_4_ = fVar178 * (float)uVar90 + fVar162 * fVar194;
        auVar140._24_4_ = fVar179 * (float)uVar92 + fVar163 * fVar195;
        fVar211 = auVar206._28_4_;
        auVar140._28_4_ = (float)uVar94 + fVar211;
        auVar144._4_4_ = fVar158 * local_2b80[1];
        auVar144._0_4_ = fVar156 * local_2b80[0];
        auVar144._8_4_ = fVar159 * local_2b80[2];
        auVar144._12_4_ = fVar160 * local_2b80[3];
        auVar144._16_4_ = fVar161 * fStack_2b70;
        auVar144._20_4_ = fVar162 * fStack_2b6c;
        auVar144._24_4_ = fVar163 * fStack_2b68;
        auVar144._28_4_ = fVar211;
        auVar134 = vaddps_avx512vl(auVar183._0_32_,auVar144);
        auVar143._4_4_ = fVar158 * local_2b60[1];
        auVar143._0_4_ = fVar156 * local_2b60[0];
        auVar143._8_4_ = fVar159 * local_2b60[2];
        auVar143._12_4_ = fVar160 * local_2b60[3];
        auVar143._16_4_ = fVar161 * fStack_2b50;
        auVar143._20_4_ = fVar162 * fStack_2b4c;
        auVar143._24_4_ = fVar163 * fStack_2b48;
        auVar143._28_4_ = fVar211;
        uVar115 = local_2bc8;
        uVar126 = local_2c08;
        while (fVar81 = fStack_2b88, fVar195 = fStack_2b8c, fVar194 = fStack_2b90,
              fVar193 = local_2ba0[3], fVar190 = local_2ba0[2], fVar212 = local_2ba0[1],
              fVar155 = local_2ba0[0], uVar115 != 0) {
          lVar119 = (long)*(int *)((long)&local_2c00.valid + uVar126 * 4) * 0x38;
          uVar114 = (ulong)*(uint *)(lVar122 + 0x20 + lVar123 * 4);
          auVar129 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar5[2].numPrimitives + lVar119) + uVar114 * 4);
          auVar157 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar119) + uVar114 * 4);
          in_ZMM11 = ZEXT1664(auVar157);
          *(int *)((long)&local_2ac0 + uVar126 * 4) = auVar129._0_4_;
          uVar213 = vextractps_avx(auVar129,1);
          *(undefined4 *)((long)&local_2ac0 + uVar126 * 4 + 0x20) = uVar213;
          uVar213 = vextractps_avx(auVar129,2);
          *(undefined4 *)((long)&local_2ac0 + uVar126 * 4 + 0x40) = uVar213;
          local_2ba0[uVar126] = auVar157._0_4_;
          fVar155 = (float)vextractps_avx(auVar157,1);
          local_2b80[uVar126] = fVar155;
          fVar155 = (float)vextractps_avx(auVar157,2);
          local_2b60[uVar126] = fVar155;
          uVar114 = uVar126 & 0x3f;
          uVar126 = 0;
          uVar115 = uVar115 ^ 1L << uVar114;
          for (uVar114 = uVar115; (uVar114 & 1) == 0; uVar114 = uVar114 >> 1 | 0x8000000000000000) {
            uVar126 = uVar126 + 1;
          }
        }
        auVar206._0_4_ = (float)uVar2 * fVar173;
        auVar206._4_4_ = (float)uVar83 * fVar174;
        auVar206._8_4_ = (float)uVar85 * fVar175;
        auVar206._12_4_ = (float)uVar87 * fVar176;
        auVar206._16_4_ = (float)uVar89 * fVar177;
        auVar206._20_4_ = (float)uVar91 * fVar178;
        auVar206._28_36_ = in_ZMM11._28_36_;
        auVar206._24_4_ = (float)uVar93 * fVar179;
        auVar166._0_4_ = fVar3 * fVar156;
        auVar166._4_4_ = fVar75 * fVar158;
        auVar166._8_4_ = fVar76 * fVar159;
        auVar166._12_4_ = fVar77 * fVar160;
        auVar166._16_4_ = fVar78 * fVar161;
        auVar166._20_4_ = fVar79 * fVar162;
        auVar166._28_36_ = in_ZMM12._28_36_;
        auVar166._24_4_ = fVar80 * fVar163;
        uVar213 = local_2ac0._0_4_;
        uVar82 = local_2ac0._4_4_;
        uVar84 = local_2ac0._8_4_;
        uVar86 = local_2ac0._12_4_;
        uVar88 = local_2ac0._16_4_;
        uVar90 = local_2ac0._20_4_;
        uVar92 = local_2ac0._24_4_;
        uVar94 = local_2ac0._28_4_;
        uVar2 = local_2ac0._64_4_;
        uVar83 = local_2ac0._68_4_;
        uVar85 = local_2ac0._72_4_;
        uVar87 = local_2ac0._76_4_;
        uVar89 = local_2ac0._80_4_;
        uVar91 = local_2ac0._84_4_;
        uVar93 = local_2ac0._88_4_;
        auVar223._0_4_ = fVar173 * (float)local_2ac0._32_4_;
        auVar223._4_4_ = fVar174 * (float)local_2ac0._36_4_;
        auVar223._8_4_ = fVar175 * (float)local_2ac0._40_4_;
        auVar223._12_4_ = fVar176 * (float)local_2ac0._44_4_;
        auVar223._16_4_ = fVar177 * (float)local_2ac0._48_4_;
        auVar223._20_4_ = fVar178 * (float)local_2ac0._52_4_;
        auVar223._24_4_ = fVar179 * (float)local_2ac0._56_4_;
        auVar183 = ZEXT3264(auVar223._0_32_);
        auVar135 = vaddps_avx512vl(auVar206._0_32_,auVar166._0_32_);
        auVar145._4_4_ = fVar158 * local_2b80[1];
        auVar145._0_4_ = fVar156 * local_2b80[0];
        auVar145._8_4_ = fVar159 * local_2b80[2];
        auVar145._12_4_ = fVar160 * local_2b80[3];
        auVar145._16_4_ = fVar161 * fStack_2b70;
        auVar145._20_4_ = fVar162 * fStack_2b6c;
        auVar145._24_4_ = fVar163 * fStack_2b68;
        auVar145._28_4_ = in_ZMM11._28_4_;
        auVar132 = vaddps_avx512vl(auVar223._0_32_,auVar145);
        auVar15._4_4_ = fVar158 * local_2b60[1];
        auVar15._0_4_ = fVar156 * local_2b60[0];
        auVar15._8_4_ = fVar159 * local_2b60[2];
        auVar15._12_4_ = fVar160 * local_2b60[3];
        auVar15._16_4_ = fVar161 * fStack_2b50;
        auVar15._20_4_ = fVar162 * fStack_2b4c;
        auVar15._24_4_ = fVar163 * fStack_2b48;
        auVar15._28_4_ = in_ZMM11._28_4_;
        uVar115 = local_2bc8;
        uVar126 = local_2c08;
        while (auVar223._28_36_ = auVar183._28_36_, uVar115 != 0) {
          lVar119 = (long)*(int *)((long)&local_2c00.valid + uVar126 * 4) * 0x38;
          uVar114 = (ulong)*(uint *)(lVar122 + 0x30 + lVar123 * 4);
          auVar129 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar5[2].numPrimitives + lVar119) + uVar114 * 4);
          auVar157 = *(undefined1 (*) [16])
                      (*(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar119) + uVar114 * 4);
          auVar183 = ZEXT1664(auVar157);
          *(int *)((long)&local_2ac0 + uVar126 * 4) = auVar129._0_4_;
          uVar4 = vextractps_avx(auVar129,1);
          *(undefined4 *)((long)&local_2ac0 + uVar126 * 4 + 0x20) = uVar4;
          uVar4 = vextractps_avx(auVar129,2);
          *(undefined4 *)((long)&local_2ac0 + uVar126 * 4 + 0x40) = uVar4;
          local_2ba0[uVar126] = auVar157._0_4_;
          fVar3 = (float)vextractps_avx(auVar157,1);
          local_2b80[uVar126] = fVar3;
          fVar3 = (float)vextractps_avx(auVar157,2);
          local_2b60[uVar126] = fVar3;
          uVar114 = uVar126 & 0x3f;
          uVar126 = 0;
          uVar115 = uVar115 ^ 1L << uVar114;
          for (uVar114 = uVar115; (uVar114 & 1) == 0; uVar114 = uVar114 >> 1 | 0x8000000000000000) {
            uVar126 = uVar126 + 1;
          }
        }
        auVar142._0_4_ = fVar173 * (float)uVar95 + fVar180;
        auVar142._4_4_ = fVar174 * (float)uVar97 + fVar184;
        auVar142._8_4_ = fVar175 * (float)uVar99 + fVar185;
        auVar142._12_4_ = fVar176 * (float)uVar101 + fVar186;
        auVar142._16_4_ = fVar177 * (float)uVar103 + fVar187;
        auVar142._20_4_ = fVar178 * (float)uVar105 + fVar188;
        auVar142._24_4_ = fVar179 * (float)uVar107 + fVar189;
        auVar142._28_4_ = (float)uVar109 + fVar196;
        auVar146._4_4_ = fVar174 * (float)uVar98;
        auVar146._0_4_ = fVar173 * (float)uVar96;
        auVar146._8_4_ = fVar175 * (float)uVar100;
        auVar146._12_4_ = fVar176 * (float)uVar102;
        auVar146._16_4_ = fVar177 * (float)uVar104;
        auVar146._20_4_ = fVar178 * (float)uVar106;
        auVar146._24_4_ = fVar179 * (float)uVar108;
        auVar146._28_4_ = fVar196;
        auVar143 = vaddps_avx512vl(auVar146,auVar143);
        auVar147._4_4_ = (float)uVar82 * fVar174;
        auVar147._0_4_ = (float)uVar213 * fVar173;
        auVar147._8_4_ = (float)uVar84 * fVar175;
        auVar147._12_4_ = (float)uVar86 * fVar176;
        auVar147._16_4_ = (float)uVar88 * fVar177;
        auVar147._20_4_ = (float)uVar90 * fVar178;
        auVar147._24_4_ = (float)uVar92 * fVar179;
        auVar147._28_4_ = fVar196;
        auVar148._4_4_ = (float)uVar83 * fVar174;
        auVar148._0_4_ = (float)uVar2 * fVar173;
        auVar148._8_4_ = (float)uVar85 * fVar175;
        auVar148._12_4_ = (float)uVar87 * fVar176;
        auVar148._16_4_ = (float)uVar89 * fVar177;
        auVar148._20_4_ = (float)uVar91 * fVar178;
        auVar148._24_4_ = (float)uVar93 * fVar179;
        auVar148._28_4_ = uVar110;
        auVar144 = vaddps_avx512vl(auVar148,auVar15);
        auVar149._4_4_ = fVar212 * fVar158;
        auVar149._0_4_ = fVar155 * fVar156;
        auVar149._8_4_ = fVar190 * fVar159;
        auVar149._12_4_ = fVar193 * fVar160;
        auVar149._16_4_ = fVar194 * fVar161;
        auVar149._20_4_ = fVar195 * fVar162;
        auVar149._24_4_ = fVar81 * fVar163;
        auVar149._28_4_ = uVar110;
        auVar150._4_4_ = fVar174 * (float)local_2ac0._4_4_;
        auVar150._0_4_ = fVar173 * (float)local_2ac0._0_4_;
        auVar150._8_4_ = fVar175 * (float)local_2ac0._8_4_;
        auVar150._12_4_ = fVar176 * (float)local_2ac0._12_4_;
        auVar150._16_4_ = fVar177 * (float)local_2ac0._16_4_;
        auVar150._20_4_ = fVar178 * (float)local_2ac0._20_4_;
        auVar150._24_4_ = fVar179 * (float)local_2ac0._24_4_;
        auVar150._28_4_ = fVar211;
        auVar136 = vaddps_avx512vl(auVar147,auVar149);
        auVar139._4_4_ = fVar174 * (float)local_2ac0._68_4_;
        auVar139._0_4_ = fVar173 * (float)local_2ac0._64_4_;
        auVar139._8_4_ = fVar175 * (float)local_2ac0._72_4_;
        auVar139._12_4_ = fVar176 * (float)local_2ac0._76_4_;
        auVar139._16_4_ = fVar177 * (float)local_2ac0._80_4_;
        auVar139._20_4_ = fVar178 * (float)local_2ac0._84_4_;
        auVar139._24_4_ = fVar179 * (float)local_2ac0._88_4_;
        auVar139._28_4_ = auVar130._28_4_;
        auVar151._4_4_ = fVar158 * local_2ba0[1];
        auVar151._0_4_ = fVar156 * local_2ba0[0];
        auVar151._8_4_ = fVar159 * local_2ba0[2];
        auVar151._12_4_ = fVar160 * local_2ba0[3];
        auVar151._16_4_ = fVar161 * fStack_2b90;
        auVar151._20_4_ = fVar162 * fStack_2b8c;
        auVar151._24_4_ = fVar163 * fStack_2b88;
        auVar151._28_4_ = fVar196;
        auVar137 = vaddps_avx512vl(auVar150,auVar151);
        local_2b40._0_4_ = fVar173 * (float)local_2ac0._32_4_ + fVar156 * local_2b80[0];
        local_2b40._4_4_ = fVar174 * (float)local_2ac0._36_4_ + fVar158 * local_2b80[1];
        local_2b40._8_4_ = fVar175 * (float)local_2ac0._40_4_ + fVar159 * local_2b80[2];
        local_2b40._12_4_ = fVar176 * (float)local_2ac0._44_4_ + fVar160 * local_2b80[3];
        local_2b40._16_4_ = fVar177 * (float)local_2ac0._48_4_ + fVar161 * fStack_2b70;
        local_2b40._20_4_ = fVar178 * (float)local_2ac0._52_4_ + fVar162 * fStack_2b6c;
        local_2b40._24_4_ = fVar179 * (float)local_2ac0._56_4_ + fVar163 * fStack_2b68;
        local_2b40._28_4_ = (float)uVar94 + fVar196;
        local_2b20._0_4_ = fVar173 * (float)local_2ac0._64_4_ + fVar156 * local_2b60[0];
        local_2b20._4_4_ = fVar174 * (float)local_2ac0._68_4_ + fVar158 * local_2b60[1];
        local_2b20._8_4_ = fVar175 * (float)local_2ac0._72_4_ + fVar159 * local_2b60[2];
        local_2b20._12_4_ = fVar176 * (float)local_2ac0._76_4_ + fVar160 * local_2b60[3];
        local_2b20._16_4_ = fVar177 * (float)local_2ac0._80_4_ + fVar161 * fStack_2b50;
        local_2b20._20_4_ = fVar178 * (float)local_2ac0._84_4_ + fVar162 * fStack_2b4c;
        local_2b20._24_4_ = fVar179 * (float)local_2ac0._88_4_ + fVar163 * fStack_2b48;
        local_2b20._28_4_ = auVar130._28_4_ + auVar133._28_4_;
      }
      auVar146 = vsubps_avx512vl(auVar140,auVar135);
      auVar147 = vsubps_avx512vl(auVar141,auVar134);
      in_ZMM10 = ZEXT3264(auVar147);
      auVar148 = vsubps_avx512vl(auVar142,auVar143);
      in_ZMM11 = ZEXT3264(auVar148);
      auVar149 = vsubps_avx512vl(auVar137,auVar140);
      auVar150 = vsubps_avx512vl(local_2b40,auVar141);
      auVar151 = vsubps_avx512vl(local_2b20,auVar142);
      auVar130 = vmulps_avx512vl(auVar147,auVar151);
      vVar152.field_0 =
           (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
           vfmsub231ps_avx512vl(auVar130,auVar150,auVar148);
      auVar66._4_4_ = auVar148._4_4_ * auVar149._4_4_;
      auVar66._0_4_ = auVar148._0_4_ * auVar149._0_4_;
      auVar66._8_4_ = auVar148._8_4_ * auVar149._8_4_;
      auVar66._12_4_ = auVar148._12_4_ * auVar149._12_4_;
      auVar66._16_4_ = auVar148._16_4_ * auVar149._16_4_;
      auVar66._20_4_ = auVar148._20_4_ * auVar149._20_4_;
      auVar66._24_4_ = auVar148._24_4_ * auVar149._24_4_;
      auVar66._28_4_ = auVar139._28_4_;
      vVar153.field_0 =
           (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
           vfmsub231ps_avx512vl(auVar66,auVar151,auVar146);
      auVar139 = vmulps_avx512vl(auVar146,auVar150);
      auVar164 = vfmsub231ps_fma(auVar139,auVar149,auVar147);
      auVar183 = ZEXT1664(auVar164);
      auVar145 = vsubps_avx(auVar140,*(undefined1 (*) [32])ray);
      auVar15 = vsubps_avx(auVar141,*(undefined1 (*) [32])(ray + 0x20));
      auVar206 = ZEXT3264(auVar15);
      auVar142 = vsubps_avx(auVar142,*(undefined1 (*) [32])(ray + 0x40));
      auVar130 = *(undefined1 (*) [32])(ray + 0x80);
      auVar133 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar141 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar53._4_4_ = auVar133._4_4_ * auVar142._4_4_;
      auVar53._0_4_ = auVar133._0_4_ * auVar142._0_4_;
      auVar53._8_4_ = auVar133._8_4_ * auVar142._8_4_;
      auVar53._12_4_ = auVar133._12_4_ * auVar142._12_4_;
      auVar53._16_4_ = auVar133._16_4_ * auVar142._16_4_;
      auVar53._20_4_ = auVar133._20_4_ * auVar142._20_4_;
      auVar53._24_4_ = auVar133._24_4_ * auVar142._24_4_;
      auVar53._28_4_ = auVar140._28_4_;
      auVar200 = vfmsub231ps_fma(auVar53,auVar15,auVar141);
      auVar171 = (undefined1  [36])0x0;
      auVar219._0_4_ = auVar141._0_4_ * auVar145._0_4_;
      auVar219._4_4_ = auVar141._4_4_ * auVar145._4_4_;
      auVar219._8_4_ = auVar141._8_4_ * auVar145._8_4_;
      auVar219._12_4_ = auVar141._12_4_ * auVar145._12_4_;
      auVar219._16_4_ = auVar141._16_4_ * auVar145._16_4_;
      auVar219._20_4_ = auVar141._20_4_ * auVar145._20_4_;
      auVar219._24_4_ = auVar141._24_4_ * auVar145._24_4_;
      auVar219._28_36_ = auVar223._28_36_;
      auVar19 = vfmsub231ps_fma(auVar219._0_32_,auVar142,auVar130);
      in_ZMM13 = ZEXT1664(auVar19);
      auVar221._0_4_ = auVar130._0_4_ * auVar15._0_4_;
      auVar221._4_4_ = auVar130._4_4_ * auVar15._4_4_;
      auVar221._8_4_ = auVar130._8_4_ * auVar15._8_4_;
      auVar221._12_4_ = auVar130._12_4_ * auVar15._12_4_;
      auVar221._16_4_ = auVar130._16_4_ * auVar15._16_4_;
      auVar221._20_4_ = auVar130._20_4_ * auVar15._20_4_;
      auVar221._28_36_ = in_ZMM14._28_36_;
      auVar221._24_4_ = auVar130._24_4_ * auVar15._24_4_;
      auVar20 = vfmsub231ps_fma(auVar221._0_32_,auVar145,auVar133);
      in_ZMM14 = ZEXT1664(auVar20);
      auVar54._4_4_ = auVar164._4_4_ * auVar141._4_4_;
      auVar54._0_4_ = auVar164._0_4_ * auVar141._0_4_;
      auVar54._8_4_ = auVar164._8_4_ * auVar141._8_4_;
      auVar54._12_4_ = auVar164._12_4_ * auVar141._12_4_;
      auVar54._16_4_ = auVar141._16_4_ * 0.0;
      auVar54._20_4_ = auVar141._20_4_ * 0.0;
      auVar54._24_4_ = auVar141._24_4_ * 0.0;
      auVar54._28_4_ = auVar141._28_4_;
      auVar129 = vfmadd231ps_fma(auVar54,(undefined1  [32])vVar153.field_0,auVar133);
      auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),(undefined1  [32])vVar152.field_0,auVar130);
      vandps_avx512vl(ZEXT1632(auVar129),auVar229._0_32_);
      in_ZMM12 = ZEXT3264(auVar139);
      auVar130 = vmulps_avx512vl(auVar151,ZEXT1632(auVar20));
      auVar130 = vfmadd231ps_avx512vl(auVar130,ZEXT1632(auVar19),auVar150);
      auVar157 = vfmadd231ps_fma(auVar130,ZEXT1632(auVar200),auVar149);
      uVar214 = auVar139._0_4_;
      auVar165._0_4_ = (float)(uVar214 ^ auVar157._0_4_);
      uVar215 = auVar139._4_4_;
      auVar165._4_4_ = (float)(uVar215 ^ auVar157._4_4_);
      uVar216 = auVar139._8_4_;
      auVar165._8_4_ = (float)(uVar216 ^ auVar157._8_4_);
      uVar217 = auVar139._12_4_;
      auVar165._12_4_ = (float)(uVar217 ^ auVar157._12_4_);
      fVar211 = auVar139._16_4_;
      auVar165._16_4_ = fVar211;
      fVar155 = auVar139._20_4_;
      auVar165._20_4_ = fVar155;
      fVar212 = auVar139._24_4_;
      auVar165._24_4_ = fVar212;
      uVar218 = auVar139._28_4_;
      auVar165._28_4_ = uVar218;
      auVar168 = ZEXT436(uVar218);
      auVar223._28_36_ = ZEXT436(uVar218);
      uVar17 = vcmpps_avx512vl(auVar165,auVar131,5);
      bVar125 = (byte)uVar17 & bVar116;
      if (bVar125 != 0) {
        auVar210._0_4_ = auVar148._0_4_ * auVar20._0_4_;
        auVar210._4_4_ = auVar148._4_4_ * auVar20._4_4_;
        auVar210._8_4_ = auVar148._8_4_ * auVar20._8_4_;
        auVar210._12_4_ = auVar148._12_4_ * auVar20._12_4_;
        auVar56._16_4_ = auVar148._16_4_ * 0.0;
        auVar56._0_16_ = auVar210;
        auVar56._20_4_ = auVar148._20_4_ * 0.0;
        auVar56._24_4_ = auVar148._24_4_ * 0.0;
        auVar56._28_4_ = auVar148._28_4_;
        in_ZMM11 = ZEXT3264(auVar56);
        auVar157 = vfmadd213ps_fma(auVar147,ZEXT1632(auVar19),auVar56);
        in_ZMM10 = ZEXT1664(auVar157);
        auVar157 = vfmadd213ps_fma(auVar146,ZEXT1632(auVar200),ZEXT1632(auVar157));
        auVar169._0_4_ = (float)(uVar214 ^ auVar157._0_4_);
        auVar169._4_4_ = (float)(uVar215 ^ auVar157._4_4_);
        auVar169._8_4_ = (float)(uVar216 ^ auVar157._8_4_);
        auVar169._12_4_ = (float)(uVar217 ^ auVar157._12_4_);
        auVar169._16_4_ = fVar211;
        auVar169._20_4_ = fVar155;
        auVar169._24_4_ = fVar212;
        auVar169._28_4_ = uVar218;
        auVar172 = ZEXT436(uVar218);
        auVar171 = ZEXT436(uVar218);
        uVar17 = vcmpps_avx512vl(auVar169,auVar131,5);
        bVar125 = bVar125 & (byte)uVar17;
        if (bVar125 != 0) {
          vandps_avx512vl(ZEXT1632(auVar129),auVar224._0_32_);
          auVar133 = vsubps_avx(auVar130,auVar165);
          in_ZMM10 = ZEXT3264(auVar133);
          uVar17 = vcmpps_avx512vl(auVar133,auVar169,5);
          bVar125 = bVar125 & (byte)uVar17;
          if (bVar125 != 0) {
            local_29a0 = auVar137;
            local_2980 = auVar136;
            local_2960 = auVar144;
            local_2940 = auVar143;
            local_2920 = auVar132;
            local_2900 = auVar135;
            local_28e0 = auVar134;
            in_ZMM10 = ZEXT864(0) << 0x20;
            auVar57._4_4_ = auVar142._4_4_ * auVar164._4_4_;
            auVar57._0_4_ = auVar142._0_4_ * auVar164._0_4_;
            auVar57._8_4_ = auVar142._8_4_ * auVar164._8_4_;
            auVar57._12_4_ = auVar142._12_4_ * auVar164._12_4_;
            auVar57._16_4_ = auVar142._16_4_ * 0.0;
            auVar57._20_4_ = auVar142._20_4_ * 0.0;
            auVar57._24_4_ = auVar142._24_4_ * 0.0;
            auVar57._28_4_ = auVar142._28_4_;
            auVar157 = vfmadd213ps_fma(auVar15,(undefined1  [32])vVar153.field_0,auVar57);
            auVar157 = vfmadd213ps_fma(auVar145,(undefined1  [32])vVar152.field_0,ZEXT1632(auVar157)
                                      );
            auVar202._0_4_ = auVar130._0_4_ * *(float *)(ray + 0x60);
            auVar202._4_4_ = auVar130._4_4_ * *(float *)(ray + 100);
            auVar202._8_4_ = auVar130._8_4_ * *(float *)(ray + 0x68);
            auVar202._12_4_ = auVar130._12_4_ * *(float *)(ray + 0x6c);
            auVar202._16_4_ = auVar130._16_4_ * *(float *)(ray + 0x70);
            auVar202._20_4_ = auVar130._20_4_ * *(float *)(ray + 0x74);
            auVar202._24_4_ = auVar130._24_4_ * *(float *)(ray + 0x78);
            auVar202._28_4_ = 0;
            auVar206 = ZEXT3264(auVar202);
            auVar198._0_4_ = (float)(uVar214 ^ auVar157._0_4_);
            auVar198._4_4_ = (float)(uVar215 ^ auVar157._4_4_);
            auVar198._8_4_ = (float)(uVar216 ^ auVar157._8_4_);
            auVar198._12_4_ = (float)(uVar217 ^ auVar157._12_4_);
            auVar198._16_4_ = fVar211;
            auVar198._20_4_ = fVar155;
            auVar198._24_4_ = fVar212;
            auVar198._28_4_ = uVar218;
            auVar58._4_4_ = auVar130._4_4_ * *(float *)(ray + 0x104);
            auVar58._0_4_ = auVar130._0_4_ * *(float *)(ray + 0x100);
            auVar58._8_4_ = auVar130._8_4_ * *(float *)(ray + 0x108);
            auVar58._12_4_ = auVar130._12_4_ * *(float *)(ray + 0x10c);
            auVar58._16_4_ = auVar130._16_4_ * *(float *)(ray + 0x110);
            auVar58._20_4_ = auVar130._20_4_ * *(float *)(ray + 0x114);
            auVar58._24_4_ = auVar130._24_4_ * *(float *)(ray + 0x118);
            auVar58._28_4_ = auVar142._28_4_;
            uVar17 = vcmpps_avx512vl(auVar198,auVar58,2);
            uVar18 = vcmpps_avx512vl(auVar202,auVar198,1);
            bVar125 = bVar125 & (byte)uVar17 & (byte)uVar18;
            if (bVar125 == 0) {
LAB_01d0a41e:
              auVar132 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar131 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar134 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar133 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar128 = vxorps_avx512vl(auVar128,auVar128);
              auVar130 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar223._28_36_ = ZEXT436(uVar218);
              auVar171 = ZEXT436(uVar218);
            }
            else {
              uVar17 = vcmpps_avx512vl(ZEXT1632(auVar129),ZEXT832(0) << 0x20,4);
              bVar125 = bVar125 & (byte)uVar17;
              if (bVar125 == 0) goto LAB_01d0a41e;
              uVar214 = pGVar5->mask;
              auVar192._4_4_ = uVar214;
              auVar192._0_4_ = uVar214;
              auVar192._8_4_ = uVar214;
              auVar192._12_4_ = uVar214;
              auVar192._16_4_ = uVar214;
              auVar192._20_4_ = uVar214;
              auVar192._24_4_ = uVar214;
              auVar192._28_4_ = uVar214;
              uVar17 = vptestmd_avx512vl(auVar192,*(undefined1 (*) [32])(ray + 0x120));
              bVar125 = bVar125 & (byte)uVar17;
              if (bVar125 == 0) goto LAB_01d0a41e;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar133 = vrcp14ps_avx512vl(auVar130);
                auVar200._8_4_ = 0x3f800000;
                auVar200._0_8_ = 0x3f8000003f800000;
                auVar200._12_4_ = 0x3f800000;
                auVar205._16_4_ = 0x3f800000;
                auVar205._0_16_ = auVar200;
                auVar205._20_4_ = 0x3f800000;
                auVar205._24_4_ = 0x3f800000;
                auVar205._28_4_ = 0x3f800000;
                auVar129 = vfnmadd213ps_fma(auVar130,auVar133,auVar205);
                auVar129 = vfmadd132ps_fma(ZEXT1632(auVar129),auVar133,auVar133);
                fVar190 = auVar129._0_4_;
                fVar193 = auVar129._4_4_;
                local_2a60._4_4_ = fVar193 * auVar198._4_4_;
                local_2a60._0_4_ = fVar190 * auVar198._0_4_;
                fVar194 = auVar129._8_4_;
                local_2a60._8_4_ = fVar194 * auVar198._8_4_;
                fVar195 = auVar129._12_4_;
                local_2a60._12_4_ = fVar195 * auVar198._12_4_;
                local_2a60._16_4_ = fVar211 * 0.0;
                local_2a60._20_4_ = fVar155 * 0.0;
                local_2a60._24_4_ = fVar212 * 0.0;
                local_2a60._28_4_ = auVar133._28_4_;
                auVar62._4_4_ = fVar193 * auVar165._4_4_;
                auVar62._0_4_ = fVar190 * auVar165._0_4_;
                auVar62._8_4_ = fVar194 * auVar165._8_4_;
                auVar62._12_4_ = fVar195 * auVar165._12_4_;
                auVar62._16_4_ = fVar211 * 0.0;
                auVar62._20_4_ = fVar155 * 0.0;
                auVar62._24_4_ = fVar212 * 0.0;
                auVar62._28_4_ = uVar218;
                local_2a20 = vminps_avx(auVar62,auVar205);
                auVar63._4_4_ = fVar193 * auVar169._4_4_;
                auVar63._0_4_ = fVar190 * auVar169._0_4_;
                auVar63._8_4_ = fVar194 * auVar169._8_4_;
                auVar63._12_4_ = fVar195 * auVar169._12_4_;
                auVar63._16_4_ = fVar211 * 0.0;
                auVar63._20_4_ = fVar155 * 0.0;
                auVar63._24_4_ = fVar212 * 0.0;
                auVar63._28_4_ = uVar218;
                local_2a40 = vminps_avx(auVar63,auVar205);
                local_2c00.geometryUserPtr = local_28a0;
                local_2c00.valid = (int *)local_2ba0;
                local_2c00.context = (RTCRayQueryContext *)local_2880;
                local_2c00.ray = (RTCRayN *)local_2860;
                auVar206 = ZEXT1664(auVar200);
                in_ZMM10 = ZEXT864(0) << 0x20;
                in_ZMM11 = ZEXT1664(auVar210);
                in_ZMM12 = ZEXT1664(auVar139._0_16_);
                in_ZMM13 = ZEXT1664(auVar19);
                in_ZMM14 = ZEXT1664(auVar20);
                local_2ac0.field_0.x.field_0 = (vfloat_impl<8>)(undefined1  [32])vVar152.field_0;
                local_2ac0.field_0.y.field_0 = (vfloat_impl<8>)(undefined1  [32])vVar153.field_0;
                local_2ac0.field_0.z.field_0 = (vfloat_impl<8>)ZEXT1632(auVar164);
                std::
                _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
                ::
                _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                          ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                            *)&local_2c00,
                           (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                            *)&local_2ac0.field_0);
                pRVar6 = context->user;
                local_2a00 = vpbroadcastd_avx512vl();
                local_2a20 = vpbroadcastd_avx512vl();
                auVar168 = ZEXT436(local_2a20._28_4_);
                local_2ac0._4_4_ = local_2ba0[1];
                local_2ac0._0_4_ = local_2ba0[0];
                local_2ac0._12_4_ = local_2ba0[3];
                local_2ac0._8_4_ = local_2ba0[2];
                local_2ac0._20_4_ = fStack_2b8c;
                local_2ac0._16_4_ = fStack_2b90;
                local_2ac0._28_4_ = uStack_2b84;
                local_2ac0._24_4_ = fStack_2b88;
                local_2ac0._36_4_ = local_2b80[1];
                local_2ac0._32_4_ = local_2b80[0];
                local_2ac0._44_4_ = local_2b80[3];
                local_2ac0._40_4_ = local_2b80[2];
                local_2ac0._52_4_ = fStack_2b6c;
                local_2ac0._48_4_ = fStack_2b70;
                local_2ac0._60_4_ = uStack_2b64;
                local_2ac0._56_4_ = fStack_2b68;
                auVar129._4_4_ = local_2b60[1];
                auVar129._0_4_ = local_2b60[0];
                auVar129._8_4_ = local_2b60[2];
                auVar129._12_4_ = local_2b60[3];
                local_2ac0._80_4_ = fStack_2b50;
                local_2ac0._64_16_ = auVar129;
                local_2ac0._84_4_ = fStack_2b4c;
                local_2ac0._88_4_ = fStack_2b48;
                local_2ac0._92_4_ = uStack_2b44;
                auVar183 = ZEXT3264((undefined1  [32])local_2ac0.field_0.z.field_0);
                auVar172 = ZEXT436(local_2880._28_4_);
                local_2a40 = local_2880;
                auVar130 = vpcmpeqd_avx2(local_2a00,local_2a00);
                local_2ba8[1] = auVar130;
                *local_2ba8 = auVar130;
                local_29e0 = pRVar6->instID[0];
                uStack_29dc = local_29e0;
                uStack_29d8 = local_29e0;
                uStack_29d4 = local_29e0;
                uStack_29d0 = local_29e0;
                uStack_29cc = local_29e0;
                uStack_29c8 = local_29e0;
                uStack_29c4 = local_29e0;
                local_29c0 = pRVar6->instPrimID[0];
                uStack_29bc = local_29c0;
                uStack_29b8 = local_29c0;
                uStack_29b4 = local_29c0;
                uStack_29b0 = local_29c0;
                uStack_29ac = local_29c0;
                uStack_29a8 = local_29c0;
                uStack_29a4 = local_29c0;
                local_28c0 = *(undefined1 (*) [32])(ray + 0x100);
                auVar130 = vblendmps_avx512vl(local_28c0,local_28a0);
                bVar112 = (bool)(bVar125 >> 1 & 1);
                bVar8 = (bool)(bVar125 >> 2 & 1);
                bVar9 = (bool)(bVar125 >> 3 & 1);
                bVar10 = (bool)(bVar125 >> 4 & 1);
                bVar11 = (bool)(bVar125 >> 5 & 1);
                bVar12 = (bool)(bVar125 >> 6 & 1);
                *(uint *)(ray + 0x100) =
                     (uint)(bVar125 & 1) * auVar130._0_4_ |
                     (uint)!(bool)(bVar125 & 1) * local_28c0._0_4_;
                *(uint *)(ray + 0x104) =
                     (uint)bVar112 * auVar130._4_4_ | (uint)!bVar112 * local_28c0._4_4_;
                *(uint *)(ray + 0x108) =
                     (uint)bVar8 * auVar130._8_4_ | (uint)!bVar8 * local_28c0._8_4_;
                *(uint *)(ray + 0x10c) =
                     (uint)bVar9 * auVar130._12_4_ | (uint)!bVar9 * local_28c0._12_4_;
                *(uint *)(ray + 0x110) =
                     (uint)bVar10 * auVar130._16_4_ | (uint)!bVar10 * local_28c0._16_4_;
                *(uint *)(ray + 0x114) =
                     (uint)bVar11 * auVar130._20_4_ | (uint)!bVar11 * local_28c0._20_4_;
                *(uint *)(ray + 0x118) =
                     (uint)bVar12 * auVar130._24_4_ | (uint)!bVar12 * local_28c0._24_4_;
                *(uint *)(ray + 0x11c) =
                     (uint)(bVar125 >> 7) * auVar130._28_4_ |
                     (uint)!(bool)(bVar125 >> 7) * local_28c0._28_4_;
                local_2b00 = vpmovm2d_avx512vl((ulong)bVar125);
                local_2c00.geometryUserPtr = pGVar5->userPtr;
                local_2c00.valid = (int *)local_2b00;
                local_2c00.context = context->user;
                local_2c00.ray = (RTCRayN *)ray;
                local_2c00.hit = (RTCHitN *)&local_2ac0;
                local_2c00.N = 8;
                if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar172 = (undefined1  [36])0x0;
                  auVar183 = ZEXT1664(auVar129);
                  auVar206 = ZEXT1664(auVar206._0_16_);
                  in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                  in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                  in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                  in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                  in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                  (*pGVar5->occlusionFilterN)(&local_2c00);
                  auVar168 = extraout_var;
                }
                if (local_2b00 == (undefined1  [32])0x0) {
                  uVar126 = 0;
                }
                else {
                  p_Var7 = context->args->filter;
                  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar172 = (undefined1  [36])0x0;
                    auVar183 = ZEXT1664(auVar183._0_16_);
                    auVar206 = ZEXT1664(auVar206._0_16_);
                    in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                    in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                    in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                    in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                    (*p_Var7)(&local_2c00);
                    auVar168 = extraout_var_00;
                  }
                  uVar126 = vptestmd_avx512vl(local_2b00,local_2b00);
                  iVar113 = *(int *)(local_2c00.ray + 0x104);
                  iVar67 = *(int *)(local_2c00.ray + 0x108);
                  iVar68 = *(int *)(local_2c00.ray + 0x10c);
                  iVar69 = *(int *)(local_2c00.ray + 0x110);
                  iVar70 = *(int *)(local_2c00.ray + 0x114);
                  iVar71 = *(int *)(local_2c00.ray + 0x118);
                  iVar72 = *(int *)(local_2c00.ray + 0x11c);
                  auVar130 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar112 = (bool)((byte)uVar126 & 1);
                  bVar8 = (bool)((byte)(uVar126 >> 1) & 1);
                  bVar9 = (bool)((byte)(uVar126 >> 2) & 1);
                  bVar10 = (bool)((byte)(uVar126 >> 3) & 1);
                  bVar11 = (bool)((byte)(uVar126 >> 4) & 1);
                  bVar12 = (bool)((byte)(uVar126 >> 5) & 1);
                  bVar13 = (bool)((byte)(uVar126 >> 6) & 1);
                  bVar14 = SUB81(uVar126 >> 7,0);
                  *(uint *)&local_2c00.ray[0x100].field_0x0 =
                       (uint)bVar112 * auVar130._0_4_ |
                       (uint)!bVar112 * *(int *)&local_2c00.ray[0x100].field_0x0;
                  *(uint *)(local_2c00.ray + 0x104) =
                       (uint)bVar8 * auVar130._4_4_ | (uint)!bVar8 * iVar113;
                  *(uint *)(local_2c00.ray + 0x108) =
                       (uint)bVar9 * auVar130._8_4_ | (uint)!bVar9 * iVar67;
                  *(uint *)(local_2c00.ray + 0x10c) =
                       (uint)bVar10 * auVar130._12_4_ | (uint)!bVar10 * iVar68;
                  *(uint *)(local_2c00.ray + 0x110) =
                       (uint)bVar11 * auVar130._16_4_ | (uint)!bVar11 * iVar69;
                  *(uint *)(local_2c00.ray + 0x114) =
                       (uint)bVar12 * auVar130._20_4_ | (uint)!bVar12 * iVar70;
                  *(uint *)(local_2c00.ray + 0x118) =
                       (uint)bVar13 * auVar130._24_4_ | (uint)!bVar13 * iVar71;
                  *(uint *)(local_2c00.ray + 0x11c) =
                       (uint)bVar14 * auVar130._28_4_ | (uint)!bVar14 * iVar72;
                }
                bVar125 = (byte)uVar126;
                bVar112 = (bool)((byte)(uVar126 >> 1) & 1);
                bVar8 = (bool)((byte)(uVar126 >> 2) & 1);
                bVar9 = (bool)((byte)(uVar126 >> 3) & 1);
                bVar10 = (bool)((byte)(uVar126 >> 4) & 1);
                bVar11 = (bool)((byte)(uVar126 >> 5) & 1);
                bVar12 = (bool)((byte)(uVar126 >> 6) & 1);
                bVar13 = (bool)((byte)(uVar126 >> 7) & 1);
                *(uint *)local_2bb8 =
                     (uint)(bVar125 & 1) * *(int *)local_2bb8 |
                     (uint)!(bool)(bVar125 & 1) * local_28c0._0_4_;
                *(uint *)(local_2bb8 + 4) =
                     (uint)bVar112 * *(int *)(local_2bb8 + 4) | (uint)!bVar112 * local_28c0._4_4_;
                *(uint *)(local_2bb8 + 8) =
                     (uint)bVar8 * *(int *)(local_2bb8 + 8) | (uint)!bVar8 * local_28c0._8_4_;
                *(uint *)(local_2bb8 + 0xc) =
                     (uint)bVar9 * *(int *)(local_2bb8 + 0xc) | (uint)!bVar9 * local_28c0._12_4_;
                *(uint *)(local_2bb8 + 0x10) =
                     (uint)bVar10 * *(int *)(local_2bb8 + 0x10) | (uint)!bVar10 * local_28c0._16_4_;
                *(uint *)(local_2bb8 + 0x14) =
                     (uint)bVar11 * *(int *)(local_2bb8 + 0x14) | (uint)!bVar11 * local_28c0._20_4_;
                *(uint *)(local_2bb8 + 0x18) =
                     (uint)bVar12 * *(int *)(local_2bb8 + 0x18) | (uint)!bVar12 * local_28c0._24_4_;
                *(uint *)(local_2bb8 + 0x1c) =
                     (uint)bVar13 * *(int *)(local_2bb8 + 0x1c) | (uint)!bVar13 * local_28c0._28_4_;
              }
              bVar116 = bVar116 & ~bVar125;
              auVar132 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar131 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar134 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar133 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar128 = vxorps_avx512vl(auVar128,auVar128);
              auVar130 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar223._28_36_ = auVar168;
              auVar171 = auVar172;
            }
            auVar229 = ZEXT3264(auVar130);
            auVar228 = ZEXT1664(auVar128);
            auVar227 = ZEXT3264(auVar133);
            auVar226 = ZEXT3264(auVar134);
            auVar225 = ZEXT3264(auVar131);
            auVar224 = ZEXT3264(auVar132);
            auVar136 = local_2980;
            auVar137 = local_29a0;
            auVar132 = local_2920;
            auVar144 = local_2960;
            auVar135 = local_2900;
            auVar134 = local_28e0;
            auVar143 = local_2940;
          }
        }
      }
      auVar128 = auVar228._0_16_;
      if (bVar116 == 0) {
        bVar116 = 0;
        uVar126 = local_2bc0;
        goto LAB_01d0aa27;
      }
      auVar131 = vsubps_avx512vl(auVar136,auVar137);
      auVar183 = ZEXT3264(auVar131);
      auVar137 = vsubps_avx512vl(auVar132,local_2b40);
      auVar141 = vsubps_avx512vl(auVar144,local_2b20);
      in_ZMM10 = ZEXT3264(auVar141);
      auVar135 = vsubps_avx512vl(auVar135,auVar136);
      auVar140 = vsubps_avx512vl(auVar134,auVar132);
      auVar143 = vsubps_avx512vl(auVar143,auVar144);
      auVar130 = vmulps_avx512vl(auVar137,auVar143);
      auVar157 = vfmsub231ps_fma(auVar130,auVar140,auVar141);
      auVar167._0_4_ = auVar141._0_4_ * auVar135._0_4_;
      auVar167._4_4_ = auVar141._4_4_ * auVar135._4_4_;
      auVar167._8_4_ = auVar141._8_4_ * auVar135._8_4_;
      auVar167._12_4_ = auVar141._12_4_ * auVar135._12_4_;
      auVar167._16_4_ = auVar141._16_4_ * auVar135._16_4_;
      auVar167._20_4_ = auVar141._20_4_ * auVar135._20_4_;
      auVar167._24_4_ = auVar141._24_4_ * auVar135._24_4_;
      auVar167._28_36_ = auVar223._28_36_;
      vVar152.field_0 =
           (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
           vfmsub231ps_avx512vl(auVar167._0_32_,auVar143,auVar131);
      auVar170._0_4_ = auVar140._0_4_ * auVar131._0_4_;
      auVar170._4_4_ = auVar140._4_4_ * auVar131._4_4_;
      auVar170._8_4_ = auVar140._8_4_ * auVar131._8_4_;
      auVar170._12_4_ = auVar140._12_4_ * auVar131._12_4_;
      auVar170._16_4_ = auVar140._16_4_ * auVar131._16_4_;
      auVar170._20_4_ = auVar140._20_4_ * auVar131._20_4_;
      auVar170._24_4_ = auVar140._24_4_ * auVar131._24_4_;
      auVar170._28_36_ = auVar171;
      auVar164 = vfmsub231ps_fma(auVar170._0_32_,auVar135,auVar137);
      auVar136 = vsubps_avx512vl(auVar136,*(undefined1 (*) [32])ray);
      auVar132 = vsubps_avx512vl(auVar132,*(undefined1 (*) [32])(ray + 0x20));
      auVar206 = ZEXT3264(auVar132);
      auVar144 = vsubps_avx512vl(auVar144,*(undefined1 (*) [32])(ray + 0x40));
      auVar130 = *(undefined1 (*) [32])(ray + 0x80);
      auVar133 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar134 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar145 = vmulps_avx512vl(auVar133,auVar144);
      auVar200 = vfmsub231ps_fma(auVar145,auVar132,auVar134);
      in_ZMM12 = ZEXT1664(auVar200);
      auVar220._0_4_ = auVar134._0_4_ * auVar136._0_4_;
      auVar220._4_4_ = auVar134._4_4_ * auVar136._4_4_;
      auVar220._8_4_ = auVar134._8_4_ * auVar136._8_4_;
      auVar220._12_4_ = auVar134._12_4_ * auVar136._12_4_;
      auVar220._16_4_ = auVar134._16_4_ * auVar136._16_4_;
      auVar220._20_4_ = auVar134._20_4_ * auVar136._20_4_;
      auVar220._28_36_ = in_ZMM13._28_36_;
      auVar220._24_4_ = auVar134._24_4_ * auVar136._24_4_;
      auVar19 = vfmsub231ps_fma(auVar220._0_32_,auVar144,auVar130);
      in_ZMM13 = ZEXT1664(auVar19);
      auVar222._0_4_ = auVar130._0_4_ * auVar132._0_4_;
      auVar222._4_4_ = auVar130._4_4_ * auVar132._4_4_;
      auVar222._8_4_ = auVar130._8_4_ * auVar132._8_4_;
      auVar222._12_4_ = auVar130._12_4_ * auVar132._12_4_;
      auVar222._16_4_ = auVar130._16_4_ * auVar132._16_4_;
      auVar222._20_4_ = auVar130._20_4_ * auVar132._20_4_;
      auVar222._28_36_ = in_ZMM14._28_36_;
      auVar222._24_4_ = auVar130._24_4_ * auVar132._24_4_;
      auVar145 = vfmsub231ps_avx512vl(auVar222._0_32_,auVar136,auVar133);
      in_ZMM14 = ZEXT3264(auVar145);
      auVar55._4_4_ = auVar134._4_4_ * auVar164._4_4_;
      auVar55._0_4_ = auVar134._0_4_ * auVar164._0_4_;
      auVar55._8_4_ = auVar134._8_4_ * auVar164._8_4_;
      auVar55._12_4_ = auVar134._12_4_ * auVar164._12_4_;
      auVar55._16_4_ = auVar134._16_4_ * 0.0;
      auVar55._20_4_ = auVar134._20_4_ * 0.0;
      auVar55._24_4_ = auVar134._24_4_ * 0.0;
      auVar55._28_4_ = auVar134._28_4_;
      auVar133 = vfmadd231ps_avx512vl(auVar55,(undefined1  [32])vVar152.field_0,auVar133);
      auVar129 = vfmadd231ps_fma(auVar133,ZEXT1632(auVar157),auVar130);
      vandps_avx512vl(ZEXT1632(auVar129),auVar229._0_32_);
      in_ZMM11 = ZEXT3264(auVar133);
      auVar130 = vmulps_avx512vl(auVar143,auVar145);
      auVar130 = vfmadd231ps_avx512vl(auVar130,ZEXT1632(auVar19),auVar140);
      auVar130 = vfmadd231ps_avx512vl(auVar130,ZEXT1632(auVar200),auVar135);
      auVar130 = vxorps_avx512vl(auVar133,auVar130);
      uVar17 = vcmpps_avx512vl(auVar130,auVar228._0_32_,5);
      bVar125 = (byte)uVar17 & bVar116;
      if (bVar125 != 0) {
        auVar59._4_4_ = auVar141._4_4_ * auVar145._4_4_;
        auVar59._0_4_ = auVar141._0_4_ * auVar145._0_4_;
        auVar59._8_4_ = auVar141._8_4_ * auVar145._8_4_;
        auVar59._12_4_ = auVar141._12_4_ * auVar145._12_4_;
        auVar59._16_4_ = auVar141._16_4_ * auVar145._16_4_;
        auVar59._20_4_ = auVar141._20_4_ * auVar145._20_4_;
        auVar59._24_4_ = auVar141._24_4_ * auVar145._24_4_;
        auVar59._28_4_ = auVar141._28_4_;
        in_ZMM10 = ZEXT3264(auVar59);
        auVar20 = vfmadd213ps_fma(auVar137,ZEXT1632(auVar19),auVar59);
        auVar20 = vfmadd213ps_fma(auVar131,ZEXT1632(auVar200),ZEXT1632(auVar20));
        auVar182._0_4_ = (float)(auVar133._0_4_ ^ auVar20._0_4_);
        auVar182._4_4_ = (float)(auVar133._4_4_ ^ auVar20._4_4_);
        auVar182._8_4_ = (float)(auVar133._8_4_ ^ auVar20._8_4_);
        auVar182._12_4_ = (float)(auVar133._12_4_ ^ auVar20._12_4_);
        fVar211 = auVar133._16_4_;
        auVar182._16_4_ = fVar211;
        fVar155 = auVar133._20_4_;
        auVar182._20_4_ = fVar155;
        fVar212 = auVar133._24_4_;
        auVar182._24_4_ = fVar212;
        uVar213 = auVar133._28_4_;
        auVar182._28_4_ = uVar213;
        auVar183 = ZEXT3264(auVar182);
        uVar17 = vcmpps_avx512vl(auVar182,auVar228._0_32_,5);
        bVar125 = bVar125 & (byte)uVar17;
        if (bVar125 != 0) {
          vandps_avx512vl(ZEXT1632(auVar129),auVar224._0_32_);
          auVar134 = vsubps_avx(auVar130,auVar130);
          in_ZMM10 = ZEXT3264(auVar134);
          uVar17 = vcmpps_avx512vl(auVar134,auVar182,5);
          bVar125 = bVar125 & (byte)uVar17;
          if (bVar125 != 0) {
            in_ZMM10 = ZEXT864(0) << 0x20;
            auVar60._4_4_ = auVar144._4_4_ * auVar164._4_4_;
            auVar60._0_4_ = auVar144._0_4_ * auVar164._0_4_;
            auVar60._8_4_ = auVar144._8_4_ * auVar164._8_4_;
            auVar60._12_4_ = auVar144._12_4_ * auVar164._12_4_;
            auVar60._16_4_ = auVar144._16_4_ * 0.0;
            auVar60._20_4_ = auVar144._20_4_ * 0.0;
            auVar60._24_4_ = auVar144._24_4_ * 0.0;
            auVar60._28_4_ = auVar144._28_4_;
            auVar20 = vfmadd213ps_fma(auVar132,(undefined1  [32])vVar152.field_0,auVar60);
            auVar20 = vfmadd213ps_fma(auVar136,ZEXT1632(auVar157),ZEXT1632(auVar20));
            fVar190 = auVar130._0_4_;
            auVar203._0_4_ = fVar190 * *(float *)(ray + 0x60);
            fVar193 = auVar130._4_4_;
            auVar203._4_4_ = fVar193 * *(float *)(ray + 100);
            fVar194 = auVar130._8_4_;
            auVar203._8_4_ = fVar194 * *(float *)(ray + 0x68);
            fVar195 = auVar130._12_4_;
            auVar203._12_4_ = fVar195 * *(float *)(ray + 0x6c);
            fVar196 = auVar130._16_4_;
            auVar203._16_4_ = fVar196 * *(float *)(ray + 0x70);
            fVar156 = auVar130._20_4_;
            auVar203._20_4_ = fVar156 * *(float *)(ray + 0x74);
            fVar158 = auVar130._24_4_;
            auVar203._24_4_ = fVar158 * *(float *)(ray + 0x78);
            auVar203._28_4_ = 0;
            auVar206 = ZEXT3264(auVar203);
            auVar199._0_4_ = (float)(auVar133._0_4_ ^ auVar20._0_4_);
            auVar199._4_4_ = (float)(auVar133._4_4_ ^ auVar20._4_4_);
            auVar199._8_4_ = (float)(auVar133._8_4_ ^ auVar20._8_4_);
            auVar199._12_4_ = (float)(auVar133._12_4_ ^ auVar20._12_4_);
            auVar199._16_4_ = fVar211;
            auVar199._20_4_ = fVar155;
            auVar199._24_4_ = fVar212;
            auVar199._28_4_ = uVar213;
            auVar61._4_4_ = fVar193 * *(float *)(ray + 0x104);
            auVar61._0_4_ = fVar190 * *(float *)(ray + 0x100);
            auVar61._8_4_ = fVar194 * *(float *)(ray + 0x108);
            auVar61._12_4_ = fVar195 * *(float *)(ray + 0x10c);
            auVar61._16_4_ = fVar196 * *(float *)(ray + 0x110);
            auVar61._20_4_ = fVar156 * *(float *)(ray + 0x114);
            auVar61._24_4_ = fVar158 * *(float *)(ray + 0x118);
            auVar61._28_4_ = auVar144._28_4_;
            uVar17 = vcmpps_avx512vl(auVar199,auVar61,2);
            uVar18 = vcmpps_avx512vl(auVar203,auVar199,1);
            bVar125 = bVar125 & (byte)uVar17 & (byte)uVar18;
            if (bVar125 == 0) {
LAB_01d0a47c:
              auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar133 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar134 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar131 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar128 = vxorps_avx512vl(auVar128,auVar128);
              auVar132 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            }
            else {
              uVar17 = vcmpps_avx512vl(ZEXT1632(auVar129),ZEXT832(0) << 0x20,4);
              bVar125 = bVar125 & (byte)uVar17;
              if (bVar125 == 0) goto LAB_01d0a47c;
              uVar126 = CONCAT44(0,*(uint *)(lVar122 + 0x40 + lVar123 * 4));
              local_2b40._0_8_ = uVar126;
              pGVar5 = (context->scene->geometries).items[uVar126].ptr;
              local_2b20._0_8_ = pGVar5;
              uVar214 = pGVar5->mask;
              auVar204._4_4_ = uVar214;
              auVar204._0_4_ = uVar214;
              auVar204._8_4_ = uVar214;
              auVar204._12_4_ = uVar214;
              auVar204._16_4_ = uVar214;
              auVar204._20_4_ = uVar214;
              auVar204._24_4_ = uVar214;
              auVar204._28_4_ = uVar214;
              auVar206 = ZEXT3264(auVar204);
              uVar17 = vptestmd_avx512vl(auVar204,*(undefined1 (*) [32])(ray + 0x120));
              bVar125 = bVar125 & (byte)uVar17;
              if (bVar125 == 0) goto LAB_01d0a47c;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                auVar131 = vrcp14ps_avx512vl(auVar130);
                auVar208._8_4_ = 0x3f800000;
                auVar208._0_8_ = 0x3f8000003f800000;
                auVar208._12_4_ = 0x3f800000;
                auVar208._16_4_ = 0x3f800000;
                auVar208._20_4_ = 0x3f800000;
                auVar208._24_4_ = 0x3f800000;
                auVar208._28_4_ = 0x3f800000;
                auVar129 = vfnmadd213ps_fma(auVar130,auVar131,auVar208);
                auVar129 = vfmadd132ps_fma(ZEXT1632(auVar129),auVar131,auVar131);
                fVar159 = auVar129._0_4_;
                fVar160 = auVar129._4_4_;
                local_2a60._4_4_ = fVar160 * auVar199._4_4_;
                local_2a60._0_4_ = fVar159 * auVar199._0_4_;
                fVar161 = auVar129._8_4_;
                local_2a60._8_4_ = fVar161 * auVar199._8_4_;
                fVar162 = auVar129._12_4_;
                local_2a60._12_4_ = fVar162 * auVar199._12_4_;
                local_2a60._16_4_ = fVar211 * 0.0;
                local_2a60._20_4_ = fVar155 * 0.0;
                local_2a60._24_4_ = fVar212 * 0.0;
                local_2a60._28_4_ = uVar213;
                auVar64._4_4_ = fVar160 * fVar193;
                auVar64._0_4_ = fVar159 * fVar190;
                auVar64._8_4_ = fVar161 * fVar194;
                auVar64._12_4_ = fVar162 * fVar195;
                auVar64._16_4_ = fVar196 * 0.0;
                auVar64._20_4_ = fVar156 * 0.0;
                auVar64._24_4_ = fVar158 * 0.0;
                auVar64._28_4_ = auVar130._28_4_;
                auVar130 = vminps_avx(auVar64,auVar208);
                auVar65._4_4_ = fVar160 * auVar182._4_4_;
                auVar65._0_4_ = fVar159 * auVar182._0_4_;
                auVar65._8_4_ = fVar161 * auVar182._8_4_;
                auVar65._12_4_ = fVar162 * auVar182._12_4_;
                auVar65._16_4_ = fVar211 * 0.0;
                auVar65._20_4_ = fVar155 * 0.0;
                auVar65._24_4_ = fVar212 * 0.0;
                auVar65._28_4_ = uVar213;
                auVar134 = vminps_avx(auVar65,auVar208);
                local_2a20 = vsubps_avx(auVar208,auVar130);
                local_2a40 = vsubps_avx(auVar208,auVar134);
                local_2ac0.field_0.x.field_0 = (vfloat_impl<8>)ZEXT1632(auVar157);
                local_2ac0.field_0.z.field_0 = (vfloat_impl<8>)ZEXT1632(auVar164);
                local_2c00.geometryUserPtr = local_28a0;
                local_2c00.valid = (int *)local_2ba0;
                local_2c00.context = (RTCRayQueryContext *)local_2880;
                local_2c00.ray = (RTCRayN *)local_2860;
                auVar206 = ZEXT1664(auVar131._0_16_);
                in_ZMM10 = ZEXT864(0) << 0x20;
                in_ZMM11 = ZEXT1664(auVar133._0_16_);
                in_ZMM12 = ZEXT1664(auVar200);
                in_ZMM13 = ZEXT1664(auVar19);
                in_ZMM14 = ZEXT1664(auVar145._0_16_);
                local_2ac0.field_0.y.field_0 = (vfloat_impl<8>)(undefined1  [32])vVar152.field_0;
                std::
                _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
                ::
                _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                          ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                            *)&local_2c00,
                           (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                            *)&local_2ac0.field_0);
                pRVar6 = context->user;
                local_2a00 = vpbroadcastd_avx512vl();
                local_2a20 = vpbroadcastd_avx512vl();
                local_2ac0._4_4_ = local_2ba0[1];
                local_2ac0._0_4_ = local_2ba0[0];
                local_2ac0._12_4_ = local_2ba0[3];
                local_2ac0._8_4_ = local_2ba0[2];
                local_2ac0._20_4_ = fStack_2b8c;
                local_2ac0._16_4_ = fStack_2b90;
                local_2ac0._28_4_ = uStack_2b84;
                local_2ac0._24_4_ = fStack_2b88;
                local_2ac0._36_4_ = local_2b80[1];
                local_2ac0._32_4_ = local_2b80[0];
                local_2ac0._44_4_ = local_2b80[3];
                local_2ac0._40_4_ = local_2b80[2];
                local_2ac0._52_4_ = fStack_2b6c;
                local_2ac0._48_4_ = fStack_2b70;
                local_2ac0._60_4_ = uStack_2b64;
                local_2ac0._56_4_ = fStack_2b68;
                auVar19._4_4_ = local_2b60[1];
                auVar19._0_4_ = local_2b60[0];
                auVar19._8_4_ = local_2b60[2];
                auVar19._12_4_ = local_2b60[3];
                local_2ac0._80_4_ = fStack_2b50;
                local_2ac0._64_16_ = auVar19;
                local_2ac0._84_4_ = fStack_2b4c;
                local_2ac0._88_4_ = fStack_2b48;
                local_2ac0._92_4_ = uStack_2b44;
                auVar183 = ZEXT3264((undefined1  [32])local_2ac0.field_0.z.field_0);
                local_2a40 = local_2880;
                auVar130 = vpcmpeqd_avx2(local_2a00,local_2a00);
                local_2ba8[1] = auVar130;
                *local_2ba8 = auVar130;
                local_29e0 = pRVar6->instID[0];
                uStack_29dc = local_29e0;
                uStack_29d8 = local_29e0;
                uStack_29d4 = local_29e0;
                uStack_29d0 = local_29e0;
                uStack_29cc = local_29e0;
                uStack_29c8 = local_29e0;
                uStack_29c4 = local_29e0;
                local_29c0 = pRVar6->instPrimID[0];
                uStack_29bc = local_29c0;
                uStack_29b8 = local_29c0;
                uStack_29b4 = local_29c0;
                uStack_29b0 = local_29c0;
                uStack_29ac = local_29c0;
                uStack_29a8 = local_29c0;
                uStack_29a4 = local_29c0;
                local_2b40 = *(undefined1 (*) [32])(ray + 0x100);
                auVar130 = vblendmps_avx512vl(local_2b40,local_28a0);
                bVar112 = (bool)(bVar125 >> 1 & 1);
                bVar8 = (bool)(bVar125 >> 2 & 1);
                bVar9 = (bool)(bVar125 >> 3 & 1);
                bVar10 = (bool)(bVar125 >> 4 & 1);
                bVar11 = (bool)(bVar125 >> 5 & 1);
                bVar12 = (bool)(bVar125 >> 6 & 1);
                *(uint *)(ray + 0x100) =
                     (uint)(bVar125 & 1) * auVar130._0_4_ |
                     (uint)!(bool)(bVar125 & 1) * local_2b40._0_4_;
                *(uint *)(ray + 0x104) =
                     (uint)bVar112 * auVar130._4_4_ | (uint)!bVar112 * local_2b40._4_4_;
                *(uint *)(ray + 0x108) =
                     (uint)bVar8 * auVar130._8_4_ | (uint)!bVar8 * local_2b40._8_4_;
                *(uint *)(ray + 0x10c) =
                     (uint)bVar9 * auVar130._12_4_ | (uint)!bVar9 * local_2b40._12_4_;
                *(uint *)(ray + 0x110) =
                     (uint)bVar10 * auVar130._16_4_ | (uint)!bVar10 * local_2b40._16_4_;
                *(uint *)(ray + 0x114) =
                     (uint)bVar11 * auVar130._20_4_ | (uint)!bVar11 * local_2b40._20_4_;
                *(uint *)(ray + 0x118) =
                     (uint)bVar12 * auVar130._24_4_ | (uint)!bVar12 * local_2b40._24_4_;
                *(uint *)(ray + 0x11c) =
                     (uint)(bVar125 >> 7) * auVar130._28_4_ |
                     (uint)!(bool)(bVar125 >> 7) * local_2b40._28_4_;
                local_2b00 = vpmovm2d_avx512vl((ulong)bVar125);
                local_2c00.geometryUserPtr = (void *)*(undefined8 *)(local_2b20._0_8_ + 0x18);
                local_2c00.valid = (int *)local_2b00;
                local_2c00.context = context->user;
                local_2c00.ray = (RTCRayN *)ray;
                local_2c00.hit = (RTCHitN *)&local_2ac0;
                local_2c00.N = 8;
                if (*(code **)(local_2b20._0_8_ + 0x48) != (code *)0x0) {
                  auVar183 = ZEXT1664(auVar19);
                  auVar206 = ZEXT1664(auVar206._0_16_);
                  in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                  in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                  in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                  in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                  in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                  (**(code **)(local_2b20._0_8_ + 0x48))(&local_2c00);
                }
                if (local_2b00 == (undefined1  [32])0x0) {
                  uVar126 = 0;
                }
                else {
                  p_Var7 = context->args->filter;
                  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(local_2b20._0_8_ + 0x3e) & 0x40) != 0)))) {
                    auVar183 = ZEXT1664(auVar183._0_16_);
                    auVar206 = ZEXT1664(auVar206._0_16_);
                    in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                    in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                    in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                    in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                    in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                    (*p_Var7)(&local_2c00);
                  }
                  uVar126 = vptestmd_avx512vl(local_2b00,local_2b00);
                  iVar113 = *(int *)(local_2c00.ray + 0x104);
                  iVar67 = *(int *)(local_2c00.ray + 0x108);
                  iVar68 = *(int *)(local_2c00.ray + 0x10c);
                  iVar69 = *(int *)(local_2c00.ray + 0x110);
                  iVar70 = *(int *)(local_2c00.ray + 0x114);
                  iVar71 = *(int *)(local_2c00.ray + 0x118);
                  iVar72 = *(int *)(local_2c00.ray + 0x11c);
                  auVar130 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar112 = (bool)((byte)uVar126 & 1);
                  bVar8 = (bool)((byte)(uVar126 >> 1) & 1);
                  bVar9 = (bool)((byte)(uVar126 >> 2) & 1);
                  bVar10 = (bool)((byte)(uVar126 >> 3) & 1);
                  bVar11 = (bool)((byte)(uVar126 >> 4) & 1);
                  bVar12 = (bool)((byte)(uVar126 >> 5) & 1);
                  bVar13 = (bool)((byte)(uVar126 >> 6) & 1);
                  bVar14 = SUB81(uVar126 >> 7,0);
                  *(uint *)&local_2c00.ray[0x100].field_0x0 =
                       (uint)bVar112 * auVar130._0_4_ |
                       (uint)!bVar112 * *(int *)&local_2c00.ray[0x100].field_0x0;
                  *(uint *)(local_2c00.ray + 0x104) =
                       (uint)bVar8 * auVar130._4_4_ | (uint)!bVar8 * iVar113;
                  *(uint *)(local_2c00.ray + 0x108) =
                       (uint)bVar9 * auVar130._8_4_ | (uint)!bVar9 * iVar67;
                  *(uint *)(local_2c00.ray + 0x10c) =
                       (uint)bVar10 * auVar130._12_4_ | (uint)!bVar10 * iVar68;
                  *(uint *)(local_2c00.ray + 0x110) =
                       (uint)bVar11 * auVar130._16_4_ | (uint)!bVar11 * iVar69;
                  *(uint *)(local_2c00.ray + 0x114) =
                       (uint)bVar12 * auVar130._20_4_ | (uint)!bVar12 * iVar70;
                  *(uint *)(local_2c00.ray + 0x118) =
                       (uint)bVar13 * auVar130._24_4_ | (uint)!bVar13 * iVar71;
                  *(uint *)(local_2c00.ray + 0x11c) =
                       (uint)bVar14 * auVar130._28_4_ | (uint)!bVar14 * iVar72;
                }
                bVar125 = (byte)uVar126;
                auVar154._0_4_ =
                     (uint)(bVar125 & 1) * *(int *)local_2bb8 |
                     (uint)!(bool)(bVar125 & 1) * local_2b40._0_4_;
                bVar112 = (bool)((byte)(uVar126 >> 1) & 1);
                auVar154._4_4_ =
                     (uint)bVar112 * *(int *)(local_2bb8 + 4) | (uint)!bVar112 * local_2b40._4_4_;
                bVar112 = (bool)((byte)(uVar126 >> 2) & 1);
                auVar154._8_4_ =
                     (uint)bVar112 * *(int *)(local_2bb8 + 8) | (uint)!bVar112 * local_2b40._8_4_;
                bVar112 = (bool)((byte)(uVar126 >> 3) & 1);
                auVar154._12_4_ =
                     (uint)bVar112 * *(int *)(local_2bb8 + 0xc) | (uint)!bVar112 * local_2b40._12_4_
                ;
                bVar112 = (bool)((byte)(uVar126 >> 4) & 1);
                auVar154._16_4_ =
                     (uint)bVar112 * *(int *)(local_2bb8 + 0x10) |
                     (uint)!bVar112 * local_2b40._16_4_;
                bVar112 = (bool)((byte)(uVar126 >> 5) & 1);
                auVar154._20_4_ =
                     (uint)bVar112 * *(int *)(local_2bb8 + 0x14) |
                     (uint)!bVar112 * local_2b40._20_4_;
                bVar112 = (bool)((byte)(uVar126 >> 6) & 1);
                auVar154._24_4_ =
                     (uint)bVar112 * *(int *)(local_2bb8 + 0x18) |
                     (uint)!bVar112 * local_2b40._24_4_;
                bVar112 = SUB81(uVar126 >> 7,0);
                auVar154._28_4_ =
                     (uint)bVar112 * *(int *)(local_2bb8 + 0x1c) |
                     (uint)!bVar112 * local_2b40._28_4_;
                *(undefined1 (*) [32])local_2bb8 = auVar154;
              }
              bVar116 = bVar116 & ~bVar125;
              auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar133 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar134 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar131 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar128 = vxorps_avx512vl(auVar128,auVar128);
              auVar132 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            }
            auVar229 = ZEXT3264(auVar132);
            auVar228 = ZEXT1664(auVar128);
            auVar227 = ZEXT3264(auVar131);
            auVar226 = ZEXT3264(auVar134);
            auVar225 = ZEXT3264(auVar133);
            auVar224 = ZEXT3264(auVar130);
          }
        }
      }
      lVar123 = lVar123 + 1;
      uVar126 = local_2bc0;
    } while (bVar116 != 0);
    bVar116 = 0;
LAB_01d0aa27:
    lVar117 = lVar117 + 1;
    bVar111 = bVar111 & bVar116;
  } while (bVar111 != 0);
  bVar111 = 0;
LAB_01d0aa42:
  auVar130 = auVar226._0_32_;
  bVar111 = (byte)local_2c54 | ~bVar111;
  local_2c54 = (uint)bVar111;
  if (bVar111 == 0xff) {
    local_2c54 = 0xff;
    goto LAB_01d0ab9c;
  }
  auVar130 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  local_2640._0_4_ =
       (uint)(bVar111 & 1) * auVar130._0_4_ | (uint)!(bool)(bVar111 & 1) * local_2640._0_4_;
  bVar112 = (bool)(bVar111 >> 1 & 1);
  local_2640._4_4_ = (uint)bVar112 * auVar130._4_4_ | (uint)!bVar112 * local_2640._4_4_;
  bVar112 = (bool)(bVar111 >> 2 & 1);
  local_2640._8_4_ = (uint)bVar112 * auVar130._8_4_ | (uint)!bVar112 * local_2640._8_4_;
  bVar112 = (bool)(bVar111 >> 3 & 1);
  local_2640._12_4_ = (uint)bVar112 * auVar130._12_4_ | (uint)!bVar112 * local_2640._12_4_;
  bVar112 = (bool)(bVar111 >> 4 & 1);
  local_2640._16_4_ = (uint)bVar112 * auVar130._16_4_ | (uint)!bVar112 * local_2640._16_4_;
  bVar112 = (bool)(bVar111 >> 5 & 1);
  local_2640._20_4_ = (uint)bVar112 * auVar130._20_4_ | (uint)!bVar112 * local_2640._20_4_;
  bVar112 = (bool)(bVar111 >> 6 & 1);
  local_2640._24_4_ = (uint)bVar112 * auVar130._24_4_ | (uint)!bVar112 * local_2640._24_4_;
  local_2640._28_4_ =
       (uint)(bVar111 >> 7) * auVar130._28_4_ | (uint)!(bool)(bVar111 >> 7) * local_2640._28_4_;
  goto LAB_01d096d5;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }